

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx::CurveNiIntersectorK<4,4>::
     intersect_n<embree::avx::OrientedCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  ulong uVar8;
  Primitive PVar9;
  uint uVar10;
  Geometry *pGVar11;
  RTCFilterFunctionN p_Var12;
  void *pvVar13;
  __int_type_conflict _Var14;
  long lVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  bool bVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  uint uVar61;
  uint uVar62;
  long lVar63;
  uint uVar64;
  ulong uVar66;
  ulong uVar67;
  vint4 bi_2;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar72 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 extraout_var [56];
  float fVar80;
  float fVar101;
  vint4 bi_1;
  undefined1 auVar82 [16];
  float fVar81;
  float fVar102;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  vint4 ai;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar109 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  float fVar118;
  float fVar136;
  float fVar137;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar138;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  vint4 bi;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  float fVar154;
  float fVar171;
  float fVar172;
  vint4 ai_2;
  undefined1 auVar155 [16];
  float fVar173;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  float fVar174;
  float fVar188;
  float fVar190;
  undefined1 auVar175 [16];
  float fVar191;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar181 [16];
  float fVar189;
  float fVar192;
  float fVar193;
  undefined1 auVar187 [32];
  vfloat4 b0;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  vint4 ai_1;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [32];
  float fVar235;
  float fVar244;
  float fVar245;
  __m128 a;
  float fVar246;
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [32];
  float fVar247;
  float fVar256;
  float fVar257;
  vfloat4 a0_1;
  float fVar258;
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  float fVar259;
  float fVar260;
  float fVar261;
  float fVar266;
  float fVar268;
  undefined1 auVar262 [16];
  float fVar270;
  undefined1 auVar263 [16];
  float fVar267;
  float fVar269;
  float fVar271;
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  float fVar272;
  float fVar273;
  float fVar274;
  float fVar275;
  float fVar276;
  float fVar277;
  float fVar278;
  float fVar279;
  float fVar286;
  float fVar287;
  undefined1 auVar280 [16];
  float fVar288;
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  float fVar289;
  float fVar290;
  undefined1 auVar285 [32];
  float fVar291;
  float fVar292;
  float fVar296;
  float fVar297;
  float fVar298;
  float fVar299;
  float fVar300;
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  vfloat4 a0;
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar306 [64];
  vfloat_impl<4> p03;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_5e8 [16];
  float local_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  undefined1 local_598 [8];
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  float fStack_580;
  undefined1 local_578 [8];
  float fStack_570;
  float fStack_56c;
  float local_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  undefined1 local_538 [16];
  float local_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 *local_430;
  RTCFilterFunctionNArguments local_428;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  undefined1 auStack_388 [16];
  uint auStack_378 [4];
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [32];
  float afStack_208 [8];
  RTCHitN local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  uint local_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint uStack_160;
  uint uStack_15c;
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar65;
  undefined1 auVar135 [32];
  undefined1 auVar305 [32];
  
  PVar9 = prim[1];
  uVar66 = (ulong)(byte)PVar9;
  auVar89 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar89 = vinsertps_avx(auVar89,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar179 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar179 = vinsertps_avx(auVar179,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar154 = *(float *)(prim + uVar66 * 0x19 + 0x12);
  auVar89 = vsubps_avx(auVar89,*(undefined1 (*) [16])(prim + uVar66 * 0x19 + 6));
  auVar103._0_4_ = fVar154 * auVar89._0_4_;
  auVar103._4_4_ = fVar154 * auVar89._4_4_;
  auVar103._8_4_ = fVar154 * auVar89._8_4_;
  auVar103._12_4_ = fVar154 * auVar89._12_4_;
  auVar194._0_4_ = fVar154 * auVar179._0_4_;
  auVar194._4_4_ = fVar154 * auVar179._4_4_;
  auVar194._8_4_ = fVar154 * auVar179._8_4_;
  auVar194._12_4_ = fVar154 * auVar179._12_4_;
  auVar89 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 4 + 6)));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar179 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 5 + 6)));
  auVar179 = vcvtdq2ps_avx(auVar179);
  auVar169 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 6 + 6)));
  auVar169 = vcvtdq2ps_avx(auVar169);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0xb + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar250 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar9 * 0xc) + 6)));
  auVar250 = vcvtdq2ps_avx(auVar250);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar9 * 0xc + uVar66 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  uVar67 = (ulong)(uint)((int)(uVar66 * 9) * 2);
  auVar69 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 + 6)));
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar70 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 + uVar66 + 6)));
  auVar70 = vcvtdq2ps_avx(auVar70);
  uVar67 = (ulong)(uint)((int)(uVar66 * 5) << 2);
  auVar88 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 + 6)));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar68 = vshufps_avx(auVar194,auVar194,0);
  auVar73 = vshufps_avx(auVar194,auVar194,0x55);
  auVar110 = vshufps_avx(auVar194,auVar194,0xaa);
  fVar154 = auVar110._0_4_;
  fVar118 = auVar110._4_4_;
  fVar171 = auVar110._8_4_;
  fVar136 = auVar110._12_4_;
  fVar174 = auVar73._0_4_;
  fVar188 = auVar73._4_4_;
  fVar190 = auVar73._8_4_;
  fVar191 = auVar73._12_4_;
  fVar172 = auVar68._0_4_;
  fVar137 = auVar68._4_4_;
  fVar173 = auVar68._8_4_;
  fVar138 = auVar68._12_4_;
  auVar262._0_4_ = fVar172 * auVar89._0_4_ + fVar174 * auVar179._0_4_ + fVar154 * auVar169._0_4_;
  auVar262._4_4_ = fVar137 * auVar89._4_4_ + fVar188 * auVar179._4_4_ + fVar118 * auVar169._4_4_;
  auVar262._8_4_ = fVar173 * auVar89._8_4_ + fVar190 * auVar179._8_4_ + fVar171 * auVar169._8_4_;
  auVar262._12_4_ = fVar138 * auVar89._12_4_ + fVar191 * auVar179._12_4_ + fVar136 * auVar169._12_4_
  ;
  auVar280._0_4_ = fVar172 * auVar16._0_4_ + fVar174 * auVar250._0_4_ + auVar17._0_4_ * fVar154;
  auVar280._4_4_ = fVar137 * auVar16._4_4_ + fVar188 * auVar250._4_4_ + auVar17._4_4_ * fVar118;
  auVar280._8_4_ = fVar173 * auVar16._8_4_ + fVar190 * auVar250._8_4_ + auVar17._8_4_ * fVar171;
  auVar280._12_4_ = fVar138 * auVar16._12_4_ + fVar191 * auVar250._12_4_ + auVar17._12_4_ * fVar136;
  auVar195._0_4_ = fVar172 * auVar69._0_4_ + fVar174 * auVar70._0_4_ + auVar88._0_4_ * fVar154;
  auVar195._4_4_ = fVar137 * auVar69._4_4_ + fVar188 * auVar70._4_4_ + auVar88._4_4_ * fVar118;
  auVar195._8_4_ = fVar173 * auVar69._8_4_ + fVar190 * auVar70._8_4_ + auVar88._8_4_ * fVar171;
  auVar195._12_4_ = fVar138 * auVar69._12_4_ + fVar191 * auVar70._12_4_ + auVar88._12_4_ * fVar136;
  auVar68 = vshufps_avx(auVar103,auVar103,0);
  auVar73 = vshufps_avx(auVar103,auVar103,0x55);
  auVar110 = vshufps_avx(auVar103,auVar103,0xaa);
  fVar154 = auVar110._0_4_;
  fVar118 = auVar110._4_4_;
  fVar171 = auVar110._8_4_;
  fVar136 = auVar110._12_4_;
  fVar174 = auVar73._0_4_;
  fVar188 = auVar73._4_4_;
  fVar190 = auVar73._8_4_;
  fVar191 = auVar73._12_4_;
  fVar172 = auVar68._0_4_;
  fVar137 = auVar68._4_4_;
  fVar173 = auVar68._8_4_;
  fVar138 = auVar68._12_4_;
  auVar139._0_4_ = fVar172 * auVar89._0_4_ + fVar174 * auVar179._0_4_ + fVar154 * auVar169._0_4_;
  auVar139._4_4_ = fVar137 * auVar89._4_4_ + fVar188 * auVar179._4_4_ + fVar118 * auVar169._4_4_;
  auVar139._8_4_ = fVar173 * auVar89._8_4_ + fVar190 * auVar179._8_4_ + fVar171 * auVar169._8_4_;
  auVar139._12_4_ = fVar138 * auVar89._12_4_ + fVar191 * auVar179._12_4_ + fVar136 * auVar169._12_4_
  ;
  auVar73._0_4_ = fVar172 * auVar16._0_4_ + auVar17._0_4_ * fVar154 + fVar174 * auVar250._0_4_;
  auVar73._4_4_ = fVar137 * auVar16._4_4_ + auVar17._4_4_ * fVar118 + fVar188 * auVar250._4_4_;
  auVar73._8_4_ = fVar173 * auVar16._8_4_ + auVar17._8_4_ * fVar171 + fVar190 * auVar250._8_4_;
  auVar73._12_4_ = fVar138 * auVar16._12_4_ + auVar17._12_4_ * fVar136 + fVar191 * auVar250._12_4_;
  auVar68._0_4_ = fVar172 * auVar69._0_4_ + fVar174 * auVar70._0_4_ + auVar88._0_4_ * fVar154;
  auVar68._4_4_ = fVar137 * auVar69._4_4_ + fVar188 * auVar70._4_4_ + auVar88._4_4_ * fVar118;
  auVar68._8_4_ = fVar173 * auVar69._8_4_ + fVar190 * auVar70._8_4_ + auVar88._8_4_ * fVar171;
  auVar68._12_4_ = fVar138 * auVar69._12_4_ + fVar191 * auVar70._12_4_ + auVar88._12_4_ * fVar136;
  auVar175._8_4_ = 0x7fffffff;
  auVar175._0_8_ = 0x7fffffff7fffffff;
  auVar175._12_4_ = 0x7fffffff;
  auVar89 = vandps_avx(auVar262,auVar175);
  auVar119._8_4_ = 0x219392ef;
  auVar119._0_8_ = 0x219392ef219392ef;
  auVar119._12_4_ = 0x219392ef;
  auVar89 = vcmpps_avx(auVar89,auVar119,1);
  auVar179 = vblendvps_avx(auVar262,auVar119,auVar89);
  auVar89 = vandps_avx(auVar280,auVar175);
  auVar89 = vcmpps_avx(auVar89,auVar119,1);
  auVar169 = vblendvps_avx(auVar280,auVar119,auVar89);
  auVar89 = vandps_avx(auVar195,auVar175);
  auVar89 = vcmpps_avx(auVar89,auVar119,1);
  auVar89 = vblendvps_avx(auVar195,auVar119,auVar89);
  auVar16 = vrcpps_avx(auVar179);
  fVar174 = auVar16._0_4_;
  auVar110._0_4_ = fVar174 * auVar179._0_4_;
  fVar188 = auVar16._4_4_;
  auVar110._4_4_ = fVar188 * auVar179._4_4_;
  fVar190 = auVar16._8_4_;
  auVar110._8_4_ = fVar190 * auVar179._8_4_;
  fVar191 = auVar16._12_4_;
  auVar110._12_4_ = fVar191 * auVar179._12_4_;
  auVar196._8_4_ = 0x3f800000;
  auVar196._0_8_ = &DAT_3f8000003f800000;
  auVar196._12_4_ = 0x3f800000;
  auVar179 = vsubps_avx(auVar196,auVar110);
  fVar174 = fVar174 + fVar174 * auVar179._0_4_;
  fVar188 = fVar188 + fVar188 * auVar179._4_4_;
  fVar190 = fVar190 + fVar190 * auVar179._8_4_;
  fVar191 = fVar191 + fVar191 * auVar179._12_4_;
  auVar179 = vrcpps_avx(auVar169);
  fVar154 = auVar179._0_4_;
  auVar155._0_4_ = fVar154 * auVar169._0_4_;
  fVar171 = auVar179._4_4_;
  auVar155._4_4_ = fVar171 * auVar169._4_4_;
  fVar172 = auVar179._8_4_;
  auVar155._8_4_ = fVar172 * auVar169._8_4_;
  fVar173 = auVar179._12_4_;
  auVar155._12_4_ = fVar173 * auVar169._12_4_;
  auVar179 = vsubps_avx(auVar196,auVar155);
  fVar154 = fVar154 + fVar154 * auVar179._0_4_;
  fVar171 = fVar171 + fVar171 * auVar179._4_4_;
  fVar172 = fVar172 + fVar172 * auVar179._8_4_;
  fVar173 = fVar173 + fVar173 * auVar179._12_4_;
  auVar179 = vrcpps_avx(auVar89);
  fVar118 = auVar179._0_4_;
  auVar120._0_4_ = fVar118 * auVar89._0_4_;
  fVar136 = auVar179._4_4_;
  auVar120._4_4_ = fVar136 * auVar89._4_4_;
  fVar137 = auVar179._8_4_;
  auVar120._8_4_ = fVar137 * auVar89._8_4_;
  fVar138 = auVar179._12_4_;
  auVar120._12_4_ = fVar138 * auVar89._12_4_;
  auVar89 = vsubps_avx(auVar196,auVar120);
  fVar118 = fVar118 + fVar118 * auVar89._0_4_;
  fVar136 = fVar136 + fVar136 * auVar89._4_4_;
  fVar137 = fVar137 + fVar137 * auVar89._8_4_;
  fVar138 = fVar138 + fVar138 * auVar89._12_4_;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar66 * 7 + 6);
  auVar89 = vpmovsxwd_avx(auVar89);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,auVar139);
  auVar104._0_4_ = fVar174 * auVar89._0_4_;
  auVar104._4_4_ = fVar188 * auVar89._4_4_;
  auVar104._8_4_ = fVar190 * auVar89._8_4_;
  auVar104._12_4_ = fVar191 * auVar89._12_4_;
  auVar179._8_8_ = 0;
  auVar179._0_8_ = *(ulong *)(prim + uVar66 * 9 + 6);
  auVar89 = vpmovsxwd_avx(auVar179);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,auVar139);
  auVar140._0_4_ = fVar174 * auVar89._0_4_;
  auVar140._4_4_ = fVar188 * auVar89._4_4_;
  auVar140._8_4_ = fVar190 * auVar89._8_4_;
  auVar140._12_4_ = fVar191 * auVar89._12_4_;
  auVar169._8_8_ = 0;
  auVar169._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar9 * 0x10 + 6);
  auVar179 = vpmovsxwd_avx(auVar169);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar9 * 0x10 + uVar66 * -2 + 6);
  auVar89 = vpmovsxwd_avx(auVar16);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,auVar73);
  auVar207._0_4_ = auVar89._0_4_ * fVar154;
  auVar207._4_4_ = auVar89._4_4_ * fVar171;
  auVar207._8_4_ = auVar89._8_4_ * fVar172;
  auVar207._12_4_ = auVar89._12_4_ * fVar173;
  auVar89 = vcvtdq2ps_avx(auVar179);
  auVar89 = vsubps_avx(auVar89,auVar73);
  auVar88._0_4_ = fVar154 * auVar89._0_4_;
  auVar88._4_4_ = fVar171 * auVar89._4_4_;
  auVar88._8_4_ = fVar172 * auVar89._8_4_;
  auVar88._12_4_ = fVar173 * auVar89._12_4_;
  auVar250._8_8_ = 0;
  auVar250._0_8_ = *(ulong *)(prim + uVar67 + uVar66 + 6);
  auVar89 = vpmovsxwd_avx(auVar250);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,auVar68);
  auVar156._0_4_ = auVar89._0_4_ * fVar118;
  auVar156._4_4_ = auVar89._4_4_ * fVar136;
  auVar156._8_4_ = auVar89._8_4_ * fVar137;
  auVar156._12_4_ = auVar89._12_4_ * fVar138;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar66 * 0x17 + 6);
  auVar89 = vpmovsxwd_avx(auVar17);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,auVar68);
  auVar69._0_4_ = auVar89._0_4_ * fVar118;
  auVar69._4_4_ = auVar89._4_4_ * fVar136;
  auVar69._8_4_ = auVar89._8_4_ * fVar137;
  auVar69._12_4_ = auVar89._12_4_ * fVar138;
  auVar89 = vpminsd_avx(auVar104,auVar140);
  auVar179 = vpminsd_avx(auVar207,auVar88);
  auVar89 = vmaxps_avx(auVar89,auVar179);
  auVar179 = vpminsd_avx(auVar156,auVar69);
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar219._4_4_ = uVar6;
  auVar219._0_4_ = uVar6;
  auVar219._8_4_ = uVar6;
  auVar219._12_4_ = uVar6;
  auVar179 = vmaxps_avx(auVar179,auVar219);
  auVar89 = vmaxps_avx(auVar89,auVar179);
  local_348._0_4_ = auVar89._0_4_ * 0.99999964;
  local_348._4_4_ = auVar89._4_4_ * 0.99999964;
  local_348._8_4_ = auVar89._8_4_ * 0.99999964;
  local_348._12_4_ = auVar89._12_4_ * 0.99999964;
  auVar89 = vpmaxsd_avx(auVar104,auVar140);
  auVar179 = vpmaxsd_avx(auVar207,auVar88);
  auVar89 = vminps_avx(auVar89,auVar179);
  auVar179 = vpmaxsd_avx(auVar156,auVar69);
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar105._4_4_ = uVar6;
  auVar105._0_4_ = uVar6;
  auVar105._8_4_ = uVar6;
  auVar105._12_4_ = uVar6;
  auVar179 = vminps_avx(auVar179,auVar105);
  auVar89 = vminps_avx(auVar89,auVar179);
  auVar70._0_4_ = auVar89._0_4_ * 1.0000004;
  auVar70._4_4_ = auVar89._4_4_ * 1.0000004;
  auVar70._8_4_ = auVar89._8_4_ * 1.0000004;
  auVar70._12_4_ = auVar89._12_4_ * 1.0000004;
  auVar89 = vpshufd_avx(ZEXT116((byte)PVar9),0);
  auVar179 = vpcmpgtd_avx(auVar89,_DAT_01ff0cf0);
  auVar89 = vcmpps_avx(local_348,auVar70,2);
  auVar89 = vandps_avx(auVar89,auVar179);
  uVar61 = vmovmskps_avx(auVar89);
  if (uVar61 == 0) {
    return;
  }
  uVar61 = uVar61 & 0xff;
  auVar76._16_16_ = mm_lookupmask_ps._240_16_;
  auVar76._0_16_ = mm_lookupmask_ps._240_16_;
  local_228 = vblendps_avx(auVar76,ZEXT832(0) << 0x20,0x80);
  local_430 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  auVar306 = ZEXT464(0) << 0x20;
LAB_00ee050e:
  uVar67 = (ulong)uVar61;
  lVar63 = 0;
  if (uVar67 != 0) {
    for (; (uVar61 >> lVar63 & 1) == 0; lVar63 = lVar63 + 1) {
    }
  }
  uVar61 = *(uint *)(prim + 2);
  uVar10 = *(uint *)(prim + lVar63 * 4 + 6);
  pGVar11 = (context->scene->geometries).items[uVar61].ptr;
  uVar66 = (ulong)*(uint *)(*(long *)&pGVar11->field_0x58 +
                           pGVar11[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar10);
  p_Var12 = pGVar11[1].intersectionFilterN;
  pvVar13 = pGVar11[2].userPtr;
  _Var14 = pGVar11[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar3 = (float *)(_Var14 + uVar66 * (long)pvVar13);
  fVar154 = *pfVar3;
  fVar118 = pfVar3[1];
  fVar171 = pfVar3[2];
  fVar136 = pfVar3[3];
  pfVar4 = (float *)(_Var14 + (uVar66 + 1) * (long)pvVar13);
  pfVar5 = (float *)(_Var14 + (uVar66 + 2) * (long)pvVar13);
  pfVar3 = (float *)(_Var14 + (long)pvVar13 * (uVar66 + 3));
  fVar172 = *pfVar3;
  fVar137 = pfVar3[1];
  fVar173 = pfVar3[2];
  fVar138 = pfVar3[3];
  uVar67 = uVar67 - 1 & uVar67;
  lVar63 = *(long *)&pGVar11[1].time_range.upper;
  pfVar3 = (float *)(lVar63 + (long)p_Var12 * uVar66);
  fVar174 = *pfVar3;
  fVar188 = pfVar3[1];
  fVar190 = pfVar3[2];
  fVar191 = pfVar3[3];
  pfVar3 = (float *)(lVar63 + (long)p_Var12 * (uVar66 + 1));
  pfVar1 = (float *)(lVar63 + (long)p_Var12 * (uVar66 + 2));
  lVar15 = 0;
  if (uVar67 != 0) {
    for (; (uVar67 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
    }
  }
  pfVar2 = (float *)(lVar63 + (long)p_Var12 * (uVar66 + 3));
  fVar80 = *pfVar2;
  fVar81 = pfVar2[1];
  fVar101 = pfVar2[2];
  fVar102 = pfVar2[3];
  if (((uVar67 != 0) && (uVar66 = uVar67 - 1 & uVar67, uVar66 != 0)) && (lVar63 = 0, uVar66 != 0)) {
    for (; (uVar66 >> lVar63 & 1) == 0; lVar63 = lVar63 + 1) {
    }
  }
  auVar89 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar169 = vinsertps_avx(auVar89,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar298 = auVar306._8_4_;
  fVar300 = auVar306._12_4_;
  fVar235 = *pfVar1 * 0.0;
  fVar244 = pfVar1[1] * 0.0;
  fVar245 = fVar298 * pfVar1[2];
  fVar246 = fVar300 * pfVar1[3];
  fVar247 = fVar235 + fVar80 * 0.0;
  fVar256 = fVar244 + fVar81 * 0.0;
  fVar257 = fVar245 + fVar101 * fVar298;
  fVar258 = fVar246 + fVar102 * fVar300;
  fVar260 = *pfVar3 * 0.0;
  fVar266 = pfVar3[1] * 0.0;
  fVar268 = fVar298 * pfVar3[2];
  fVar270 = fVar300 * pfVar3[3];
  local_578._0_4_ = fVar174 + fVar260 + fVar247;
  local_578._4_4_ = fVar188 + fVar266 + fVar256;
  fStack_570 = fVar190 + fVar268 + fVar257;
  fStack_56c = fVar191 + fVar270 + fVar258;
  auVar106._0_4_ = fVar247 + *pfVar3 * 3.0;
  auVar106._4_4_ = fVar256 + pfVar3[1] * 3.0;
  auVar106._8_4_ = fVar257 + pfVar3[2] * 3.0;
  auVar106._12_4_ = fVar258 + pfVar3[3] * 3.0;
  auVar248._0_4_ = fVar174 * 3.0;
  auVar248._4_4_ = fVar188 * 3.0;
  auVar248._8_4_ = fVar190 * 3.0;
  auVar248._12_4_ = fVar191 * 3.0;
  auVar88 = vsubps_avx(auVar106,auVar248);
  fVar279 = *pfVar5 * 0.0;
  fVar286 = pfVar5[1] * 0.0;
  fVar287 = pfVar5[2] * fVar298;
  fVar288 = pfVar5[3] * fVar300;
  fVar247 = fVar279 + fVar172 * 0.0;
  fVar256 = fVar286 + fVar137 * 0.0;
  fVar257 = fVar287 + fVar298 * fVar173;
  fVar258 = fVar288 + fVar300 * fVar138;
  fVar291 = *pfVar4 * 0.0;
  fVar296 = pfVar4[1] * 0.0;
  fVar298 = fVar298 * pfVar4[2];
  fVar300 = fVar300 * pfVar4[3];
  auVar301._0_4_ = fVar291 + fVar247 + fVar154;
  auVar301._4_4_ = fVar296 + fVar256 + fVar118;
  auVar301._8_4_ = fVar298 + fVar257 + fVar171;
  auVar301._12_4_ = fVar300 + fVar258 + fVar136;
  auVar121._0_4_ = fVar247 + *pfVar4 * 3.0;
  auVar121._4_4_ = fVar256 + pfVar4[1] * 3.0;
  auVar121._8_4_ = fVar257 + pfVar4[2] * 3.0;
  auVar121._12_4_ = fVar258 + pfVar4[3] * 3.0;
  auVar249._0_4_ = fVar154 * 3.0;
  auVar249._4_4_ = fVar118 * 3.0;
  auVar249._8_4_ = fVar171 * 3.0;
  auVar249._12_4_ = fVar136 * 3.0;
  auVar250 = vsubps_avx(auVar121,auVar249);
  auVar208._0_4_ = fVar174 * 0.0;
  auVar208._4_4_ = fVar188 * 0.0;
  auVar208._8_4_ = fVar190 * 0.0;
  auVar208._12_4_ = fVar191 * 0.0;
  auVar122._0_4_ = auVar208._0_4_ + fVar260 + fVar235 + fVar80;
  auVar122._4_4_ = auVar208._4_4_ + fVar266 + fVar244 + fVar81;
  auVar122._8_4_ = auVar208._8_4_ + fVar268 + fVar245 + fVar101;
  auVar122._12_4_ = auVar208._12_4_ + fVar270 + fVar246 + fVar102;
  auVar220._0_4_ = fVar80 * 3.0;
  auVar220._4_4_ = fVar81 * 3.0;
  auVar220._8_4_ = fVar101 * 3.0;
  auVar220._12_4_ = fVar102 * 3.0;
  auVar141._0_4_ = *pfVar1 * 3.0;
  auVar141._4_4_ = pfVar1[1] * 3.0;
  auVar141._8_4_ = pfVar1[2] * 3.0;
  auVar141._12_4_ = pfVar1[3] * 3.0;
  auVar89 = vsubps_avx(auVar220,auVar141);
  auVar142._0_4_ = fVar260 + auVar89._0_4_;
  auVar142._4_4_ = fVar266 + auVar89._4_4_;
  auVar142._8_4_ = fVar268 + auVar89._8_4_;
  auVar142._12_4_ = fVar270 + auVar89._12_4_;
  auVar68 = vsubps_avx(auVar142,auVar208);
  auVar157._0_4_ = fVar154 * 0.0;
  auVar157._4_4_ = fVar118 * 0.0;
  auVar157._8_4_ = fVar171 * 0.0;
  auVar157._12_4_ = fVar136 * 0.0;
  auVar221._0_4_ = fVar291 + fVar279 + fVar172 + auVar157._0_4_;
  auVar221._4_4_ = fVar296 + fVar286 + fVar137 + auVar157._4_4_;
  auVar221._8_4_ = fVar298 + fVar287 + fVar173 + auVar157._8_4_;
  auVar221._12_4_ = fVar300 + fVar288 + fVar138 + auVar157._12_4_;
  auVar197._0_4_ = fVar172 * 3.0;
  auVar197._4_4_ = fVar137 * 3.0;
  auVar197._8_4_ = fVar173 * 3.0;
  auVar197._12_4_ = fVar138 * 3.0;
  auVar176._0_4_ = *pfVar5 * 3.0;
  auVar176._4_4_ = pfVar5[1] * 3.0;
  auVar176._8_4_ = pfVar5[2] * 3.0;
  auVar176._12_4_ = pfVar5[3] * 3.0;
  auVar89 = vsubps_avx(auVar197,auVar176);
  auVar177._0_4_ = fVar291 + auVar89._0_4_;
  auVar177._4_4_ = fVar296 + auVar89._4_4_;
  auVar177._8_4_ = fVar298 + auVar89._8_4_;
  auVar177._12_4_ = fVar300 + auVar89._12_4_;
  auVar69 = vsubps_avx(auVar177,auVar157);
  auVar89 = vshufps_avx(auVar88,auVar88,0xc9);
  auVar179 = vshufps_avx(auVar301,auVar301,0xc9);
  fVar298 = auVar88._0_4_;
  auVar198._0_4_ = fVar298 * auVar179._0_4_;
  fVar235 = auVar88._4_4_;
  auVar198._4_4_ = fVar235 * auVar179._4_4_;
  fVar245 = auVar88._8_4_;
  auVar198._8_4_ = fVar245 * auVar179._8_4_;
  fVar247 = auVar88._12_4_;
  auVar198._12_4_ = fVar247 * auVar179._12_4_;
  auVar209._0_4_ = auVar301._0_4_ * auVar89._0_4_;
  auVar209._4_4_ = auVar301._4_4_ * auVar89._4_4_;
  auVar209._8_4_ = auVar301._8_4_ * auVar89._8_4_;
  auVar209._12_4_ = auVar301._12_4_ * auVar89._12_4_;
  auVar179 = vsubps_avx(auVar209,auVar198);
  auVar16 = vshufps_avx(auVar179,auVar179,0xc9);
  auVar179 = vshufps_avx(auVar250,auVar250,0xc9);
  auVar199._0_4_ = fVar298 * auVar179._0_4_;
  auVar199._4_4_ = fVar235 * auVar179._4_4_;
  auVar199._8_4_ = fVar245 * auVar179._8_4_;
  auVar199._12_4_ = fVar247 * auVar179._12_4_;
  auVar158._0_4_ = auVar250._0_4_ * auVar89._0_4_;
  auVar158._4_4_ = auVar250._4_4_ * auVar89._4_4_;
  auVar158._8_4_ = auVar250._8_4_ * auVar89._8_4_;
  auVar158._12_4_ = auVar250._12_4_ * auVar89._12_4_;
  auVar89 = vsubps_avx(auVar158,auVar199);
  auVar250 = vshufps_avx(auVar89,auVar89,0xc9);
  auVar89 = vshufps_avx(auVar68,auVar68,0xc9);
  auVar179 = vshufps_avx(auVar221,auVar221,0xc9);
  fVar257 = auVar68._0_4_;
  auVar159._0_4_ = fVar257 * auVar179._0_4_;
  fVar258 = auVar68._4_4_;
  auVar159._4_4_ = fVar258 * auVar179._4_4_;
  fVar260 = auVar68._8_4_;
  auVar159._8_4_ = fVar260 * auVar179._8_4_;
  fVar266 = auVar68._12_4_;
  auVar159._12_4_ = fVar266 * auVar179._12_4_;
  auVar222._0_4_ = auVar221._0_4_ * auVar89._0_4_;
  auVar222._4_4_ = auVar221._4_4_ * auVar89._4_4_;
  auVar222._8_4_ = auVar221._8_4_ * auVar89._8_4_;
  auVar222._12_4_ = auVar221._12_4_ * auVar89._12_4_;
  auVar179 = vsubps_avx(auVar222,auVar159);
  auVar17 = vshufps_avx(auVar179,auVar179,0xc9);
  auVar179 = vshufps_avx(auVar69,auVar69,0xc9);
  auVar223._0_4_ = auVar179._0_4_ * fVar257;
  auVar223._4_4_ = auVar179._4_4_ * fVar258;
  auVar223._8_4_ = auVar179._8_4_ * fVar260;
  auVar223._12_4_ = auVar179._12_4_ * fVar266;
  auVar178._0_4_ = auVar89._0_4_ * auVar69._0_4_;
  auVar178._4_4_ = auVar89._4_4_ * auVar69._4_4_;
  auVar178._8_4_ = auVar89._8_4_ * auVar69._8_4_;
  auVar178._12_4_ = auVar89._12_4_ * auVar69._12_4_;
  auVar89 = vdpps_avx(auVar16,auVar16,0x7f);
  auVar179 = vsubps_avx(auVar178,auVar223);
  auVar69 = vshufps_avx(auVar179,auVar179,0xc9);
  fVar172 = auVar89._0_4_;
  auVar110 = ZEXT416((uint)fVar172);
  auVar179 = vrsqrtss_avx(auVar110,auVar110);
  fVar154 = auVar179._0_4_;
  auVar179 = ZEXT416((uint)(fVar154 * 1.5 - fVar172 * 0.5 * fVar154 * fVar154 * fVar154));
  auVar70 = vshufps_avx(auVar179,auVar179,0);
  fVar154 = auVar16._0_4_ * auVar70._0_4_;
  fVar118 = auVar16._4_4_ * auVar70._4_4_;
  fVar171 = auVar16._8_4_ * auVar70._8_4_;
  fVar136 = auVar16._12_4_ * auVar70._12_4_;
  auVar179 = vdpps_avx(auVar16,auVar250,0x7f);
  auVar89 = vshufps_avx(auVar89,auVar89,0);
  auVar236._0_4_ = auVar250._0_4_ * auVar89._0_4_;
  auVar236._4_4_ = auVar250._4_4_ * auVar89._4_4_;
  auVar236._8_4_ = auVar250._8_4_ * auVar89._8_4_;
  auVar236._12_4_ = auVar250._12_4_ * auVar89._12_4_;
  auVar89 = vshufps_avx(auVar179,auVar179,0);
  auVar210._0_4_ = auVar16._0_4_ * auVar89._0_4_;
  auVar210._4_4_ = auVar16._4_4_ * auVar89._4_4_;
  auVar210._8_4_ = auVar16._8_4_ * auVar89._8_4_;
  auVar210._12_4_ = auVar16._12_4_ * auVar89._12_4_;
  auVar73 = vsubps_avx(auVar236,auVar210);
  auVar89 = vrcpss_avx(auVar110,auVar110);
  auVar89 = ZEXT416((uint)(auVar89._0_4_ * (2.0 - fVar172 * auVar89._0_4_)));
  auVar16 = vshufps_avx(auVar89,auVar89,0);
  auVar89 = vdpps_avx(auVar17,auVar17,0x7f);
  fVar172 = auVar89._0_4_;
  auVar110 = ZEXT416((uint)fVar172);
  auVar179 = vrsqrtss_avx(auVar110,auVar110);
  fVar137 = auVar179._0_4_;
  auVar179 = vdpps_avx(auVar17,auVar69,0x7f);
  auVar250 = ZEXT416((uint)(fVar137 * 1.5 - fVar172 * 0.5 * fVar137 * fVar137 * fVar137));
  auVar250 = vshufps_avx(auVar250,auVar250,0);
  fVar137 = auVar250._0_4_ * auVar17._0_4_;
  fVar173 = auVar250._4_4_ * auVar17._4_4_;
  fVar138 = auVar250._8_4_ * auVar17._8_4_;
  fVar174 = auVar250._12_4_ * auVar17._12_4_;
  auVar89 = vshufps_avx(auVar89,auVar89,0);
  auVar200._0_4_ = auVar89._0_4_ * auVar69._0_4_;
  auVar200._4_4_ = auVar89._4_4_ * auVar69._4_4_;
  auVar200._8_4_ = auVar89._8_4_ * auVar69._8_4_;
  auVar200._12_4_ = auVar89._12_4_ * auVar69._12_4_;
  auVar89 = vshufps_avx(auVar179,auVar179,0);
  auVar160._0_4_ = auVar89._0_4_ * auVar17._0_4_;
  auVar160._4_4_ = auVar89._4_4_ * auVar17._4_4_;
  auVar160._8_4_ = auVar89._8_4_ * auVar17._8_4_;
  auVar160._12_4_ = auVar89._12_4_ * auVar17._12_4_;
  auVar69 = vsubps_avx(auVar200,auVar160);
  auVar89 = vrcpss_avx(auVar110,auVar110);
  auVar89 = ZEXT416((uint)((2.0 - fVar172 * auVar89._0_4_) * auVar89._0_4_));
  auVar89 = vshufps_avx(auVar89,auVar89,0);
  auVar179 = vshufps_avx(_local_578,_local_578,0xff);
  auVar224._0_4_ = auVar179._0_4_ * fVar154;
  auVar224._4_4_ = auVar179._4_4_ * fVar118;
  auVar224._8_4_ = auVar179._8_4_ * fVar171;
  auVar224._12_4_ = auVar179._12_4_ * fVar136;
  _local_3a8 = vsubps_avx(_local_578,auVar224);
  auVar17 = vshufps_avx(auVar88,auVar88,0xff);
  auVar180._0_4_ =
       auVar17._0_4_ * fVar154 + auVar70._0_4_ * auVar73._0_4_ * auVar16._0_4_ * auVar179._0_4_;
  auVar180._4_4_ =
       auVar17._4_4_ * fVar118 + auVar70._4_4_ * auVar73._4_4_ * auVar16._4_4_ * auVar179._4_4_;
  auVar180._8_4_ =
       auVar17._8_4_ * fVar171 + auVar70._8_4_ * auVar73._8_4_ * auVar16._8_4_ * auVar179._8_4_;
  auVar180._12_4_ =
       auVar17._12_4_ * fVar136 + auVar70._12_4_ * auVar73._12_4_ * auVar16._12_4_ * auVar179._12_4_
  ;
  auVar17 = vsubps_avx(auVar88,auVar180);
  local_3b8._0_4_ = auVar224._0_4_ + (float)local_578._0_4_;
  local_3b8._4_4_ = auVar224._4_4_ + (float)local_578._4_4_;
  fStack_3b0 = auVar224._8_4_ + fStack_570;
  fStack_3ac = auVar224._12_4_ + fStack_56c;
  auVar179 = vshufps_avx(auVar122,auVar122,0xff);
  auVar107._0_4_ = fVar137 * auVar179._0_4_;
  auVar107._4_4_ = fVar173 * auVar179._4_4_;
  auVar107._8_4_ = fVar138 * auVar179._8_4_;
  auVar107._12_4_ = fVar174 * auVar179._12_4_;
  _local_3c8 = vsubps_avx(auVar122,auVar107);
  auVar16 = vshufps_avx(auVar68,auVar68,0xff);
  auVar82._0_4_ =
       fVar137 * auVar16._0_4_ + auVar179._0_4_ * auVar250._0_4_ * auVar69._0_4_ * auVar89._0_4_;
  auVar82._4_4_ =
       fVar173 * auVar16._4_4_ + auVar179._4_4_ * auVar250._4_4_ * auVar69._4_4_ * auVar89._4_4_;
  auVar82._8_4_ =
       fVar138 * auVar16._8_4_ + auVar179._8_4_ * auVar250._8_4_ * auVar69._8_4_ * auVar89._8_4_;
  auVar82._12_4_ =
       fVar174 * auVar16._12_4_ +
       auVar179._12_4_ * auVar250._12_4_ * auVar69._12_4_ * auVar89._12_4_;
  auVar250 = vsubps_avx(auVar68,auVar82);
  fVar300 = auVar122._0_4_ + auVar107._0_4_;
  fVar244 = auVar122._4_4_ + auVar107._4_4_;
  fVar246 = auVar122._8_4_ + auVar107._8_4_;
  fVar256 = auVar122._12_4_ + auVar107._12_4_;
  local_3d8._0_4_ = local_3a8._0_4_ + auVar17._0_4_ * 0.33333334;
  local_3d8._4_4_ = local_3a8._4_4_ + auVar17._4_4_ * 0.33333334;
  fStack_3d0 = local_3a8._8_4_ + auVar17._8_4_ * 0.33333334;
  fStack_3cc = local_3a8._12_4_ + auVar17._12_4_ * 0.33333334;
  local_268 = vsubps_avx(_local_3a8,auVar169);
  auVar179 = vmovsldup_avx(local_268);
  auVar89 = vmovshdup_avx(local_268);
  auVar16 = vshufps_avx(local_268,local_268,0xaa);
  fVar154 = pre->ray_space[k].vx.field_0.m128[0];
  fVar118 = pre->ray_space[k].vx.field_0.m128[1];
  fVar171 = pre->ray_space[k].vx.field_0.m128[2];
  fVar136 = pre->ray_space[k].vx.field_0.m128[3];
  fVar172 = pre->ray_space[k].vy.field_0.m128[0];
  fVar137 = pre->ray_space[k].vy.field_0.m128[1];
  fVar173 = pre->ray_space[k].vy.field_0.m128[2];
  fVar138 = pre->ray_space[k].vy.field_0.m128[3];
  fVar174 = pre->ray_space[k].vz.field_0.m128[0];
  fVar188 = pre->ray_space[k].vz.field_0.m128[1];
  fVar190 = pre->ray_space[k].vz.field_0.m128[2];
  fVar191 = pre->ray_space[k].vz.field_0.m128[3];
  fVar80 = fVar154 * auVar179._0_4_ + auVar16._0_4_ * fVar174 + fVar172 * auVar89._0_4_;
  fVar101 = fVar118 * auVar179._4_4_ + auVar16._4_4_ * fVar188 + fVar137 * auVar89._4_4_;
  local_578._4_4_ = fVar101;
  local_578._0_4_ = fVar80;
  fStack_570 = fVar171 * auVar179._8_4_ + auVar16._8_4_ * fVar190 + fVar173 * auVar89._8_4_;
  fStack_56c = fVar136 * auVar179._12_4_ + auVar16._12_4_ * fVar191 + fVar138 * auVar89._12_4_;
  local_278 = vsubps_avx(_local_3d8,auVar169);
  auVar16 = vshufps_avx(local_278,local_278,0xaa);
  auVar89 = vmovshdup_avx(local_278);
  auVar179 = vmovsldup_avx(local_278);
  fVar81 = auVar179._0_4_ * fVar154 + auVar89._0_4_ * fVar172 + fVar174 * auVar16._0_4_;
  fVar102 = auVar179._4_4_ * fVar118 + auVar89._4_4_ * fVar137 + fVar188 * auVar16._4_4_;
  local_598._4_4_ = fVar102;
  local_598._0_4_ = fVar81;
  fStack_590 = auVar179._8_4_ * fVar171 + auVar89._8_4_ * fVar173 + fVar190 * auVar16._8_4_;
  fStack_58c = auVar179._12_4_ * fVar136 + auVar89._12_4_ * fVar138 + fVar191 * auVar16._12_4_;
  auVar161._0_4_ = auVar250._0_4_ * 0.33333334;
  auVar161._4_4_ = auVar250._4_4_ * 0.33333334;
  auVar161._8_4_ = auVar250._8_4_ * 0.33333334;
  auVar161._12_4_ = auVar250._12_4_ * 0.33333334;
  _local_3e8 = vsubps_avx(_local_3c8,auVar161);
  local_288 = vsubps_avx(_local_3e8,auVar169);
  auVar16 = vshufps_avx(local_288,local_288,0xaa);
  auVar89 = vmovshdup_avx(local_288);
  auVar179 = vmovsldup_avx(local_288);
  auVar281._0_4_ = auVar179._0_4_ * fVar154 + auVar89._0_4_ * fVar172 + fVar174 * auVar16._0_4_;
  auVar281._4_4_ = auVar179._4_4_ * fVar118 + auVar89._4_4_ * fVar137 + fVar188 * auVar16._4_4_;
  auVar281._8_4_ = auVar179._8_4_ * fVar171 + auVar89._8_4_ * fVar173 + fVar190 * auVar16._8_4_;
  auVar281._12_4_ = auVar179._12_4_ * fVar136 + auVar89._12_4_ * fVar138 + fVar191 * auVar16._12_4_;
  local_298 = vsubps_avx(_local_3c8,auVar169);
  auVar16 = vshufps_avx(local_298,local_298,0xaa);
  auVar89 = vmovshdup_avx(local_298);
  auVar179 = vmovsldup_avx(local_298);
  auVar263._0_4_ = auVar179._0_4_ * fVar154 + auVar89._0_4_ * fVar172 + auVar16._0_4_ * fVar174;
  auVar263._4_4_ = auVar179._4_4_ * fVar118 + auVar89._4_4_ * fVar137 + auVar16._4_4_ * fVar188;
  auVar263._8_4_ = auVar179._8_4_ * fVar171 + auVar89._8_4_ * fVar173 + auVar16._8_4_ * fVar190;
  auVar263._12_4_ = auVar179._12_4_ * fVar136 + auVar89._12_4_ * fVar138 + auVar16._12_4_ * fVar191;
  local_2a8 = vsubps_avx(_local_3b8,auVar169);
  auVar16 = vshufps_avx(local_2a8,local_2a8,0xaa);
  auVar89 = vmovshdup_avx(local_2a8);
  auVar179 = vmovsldup_avx(local_2a8);
  auVar237._0_4_ = auVar179._0_4_ * fVar154 + auVar89._0_4_ * fVar172 + auVar16._0_4_ * fVar174;
  auVar237._4_4_ = auVar179._4_4_ * fVar118 + auVar89._4_4_ * fVar137 + auVar16._4_4_ * fVar188;
  auVar237._8_4_ = auVar179._8_4_ * fVar171 + auVar89._8_4_ * fVar173 + auVar16._8_4_ * fVar190;
  auVar237._12_4_ = auVar179._12_4_ * fVar136 + auVar89._12_4_ * fVar138 + auVar16._12_4_ * fVar191;
  local_3f8._0_4_ = (float)local_3b8._0_4_ + (fVar298 + auVar180._0_4_) * 0.33333334;
  local_3f8._4_4_ = (float)local_3b8._4_4_ + (fVar235 + auVar180._4_4_) * 0.33333334;
  fStack_3f0 = fStack_3b0 + (fVar245 + auVar180._8_4_) * 0.33333334;
  fStack_3ec = fStack_3ac + (fVar247 + auVar180._12_4_) * 0.33333334;
  local_2b8 = vsubps_avx(_local_3f8,auVar169);
  auVar16 = vshufps_avx(local_2b8,local_2b8,0xaa);
  auVar89 = vmovshdup_avx(local_2b8);
  auVar179 = vmovsldup_avx(local_2b8);
  auVar225._0_4_ = auVar179._0_4_ * fVar154 + auVar89._0_4_ * fVar172 + auVar16._0_4_ * fVar174;
  auVar225._4_4_ = auVar179._4_4_ * fVar118 + auVar89._4_4_ * fVar137 + auVar16._4_4_ * fVar188;
  auVar225._8_4_ = auVar179._8_4_ * fVar171 + auVar89._8_4_ * fVar173 + auVar16._8_4_ * fVar190;
  auVar225._12_4_ = auVar179._12_4_ * fVar136 + auVar89._12_4_ * fVar138 + auVar16._12_4_ * fVar191;
  auVar201._0_4_ = (fVar257 + auVar82._0_4_) * 0.33333334;
  auVar201._4_4_ = (fVar258 + auVar82._4_4_) * 0.33333334;
  auVar201._8_4_ = (fVar260 + auVar82._8_4_) * 0.33333334;
  auVar201._12_4_ = (fVar266 + auVar82._12_4_) * 0.33333334;
  auVar57._4_4_ = fVar244;
  auVar57._0_4_ = fVar300;
  auVar57._8_4_ = fVar246;
  auVar57._12_4_ = fVar256;
  _local_2f8 = vsubps_avx(auVar57,auVar201);
  local_2c8 = vsubps_avx(_local_2f8,auVar169);
  auVar16 = vshufps_avx(local_2c8,local_2c8,0xaa);
  auVar89 = vmovshdup_avx(local_2c8);
  auVar179 = vmovsldup_avx(local_2c8);
  auVar83._0_4_ = auVar179._0_4_ * fVar154 + auVar89._0_4_ * fVar172 + fVar174 * auVar16._0_4_;
  auVar83._4_4_ = auVar179._4_4_ * fVar118 + auVar89._4_4_ * fVar137 + fVar188 * auVar16._4_4_;
  auVar83._8_4_ = auVar179._8_4_ * fVar171 + auVar89._8_4_ * fVar173 + fVar190 * auVar16._8_4_;
  auVar83._12_4_ = auVar179._12_4_ * fVar136 + auVar89._12_4_ * fVar138 + fVar191 * auVar16._12_4_;
  local_2d8 = vsubps_avx(auVar57,auVar169);
  auVar169 = vshufps_avx(local_2d8,local_2d8,0xaa);
  auVar89 = vmovshdup_avx(local_2d8);
  auVar179 = vmovsldup_avx(local_2d8);
  auVar71._0_4_ = fVar154 * auVar179._0_4_ + fVar172 * auVar89._0_4_ + fVar174 * auVar169._0_4_;
  auVar71._4_4_ = fVar118 * auVar179._4_4_ + fVar137 * auVar89._4_4_ + fVar188 * auVar169._4_4_;
  auVar71._8_4_ = fVar171 * auVar179._8_4_ + fVar173 * auVar89._8_4_ + fVar190 * auVar169._8_4_;
  auVar71._12_4_ = fVar136 * auVar179._12_4_ + fVar138 * auVar89._12_4_ + fVar191 * auVar169._12_4_;
  auVar16 = vmovlhps_avx(_local_578,auVar237);
  auVar250 = vmovlhps_avx(_local_598,auVar225);
  auVar17 = vmovlhps_avx(auVar281,auVar83);
  auVar69 = vmovlhps_avx(auVar263,auVar71);
  auVar89 = vminps_avx(auVar16,auVar250);
  auVar179 = vminps_avx(auVar17,auVar69);
  auVar169 = vminps_avx(auVar89,auVar179);
  auVar89 = vmaxps_avx(auVar16,auVar250);
  auVar179 = vmaxps_avx(auVar17,auVar69);
  auVar89 = vmaxps_avx(auVar89,auVar179);
  auVar179 = vshufpd_avx(auVar169,auVar169,3);
  auVar169 = vminps_avx(auVar169,auVar179);
  auVar179 = vshufpd_avx(auVar89,auVar89,3);
  auVar179 = vmaxps_avx(auVar89,auVar179);
  auVar181._8_4_ = 0x7fffffff;
  auVar181._0_8_ = 0x7fffffff7fffffff;
  auVar181._12_4_ = 0x7fffffff;
  auVar89 = vandps_avx(auVar169,auVar181);
  auVar179 = vandps_avx(auVar179,auVar181);
  auVar89 = vmaxps_avx(auVar89,auVar179);
  auVar179 = vmovshdup_avx(auVar89);
  auVar89 = vmaxss_avx(auVar179,auVar89);
  fVar118 = auVar89._0_4_ * 9.536743e-07;
  auVar89 = vshufps_avx(ZEXT416((uint)fVar118),ZEXT416((uint)fVar118),0);
  local_138._16_16_ = auVar89;
  local_138._0_16_ = auVar89;
  auVar72._0_8_ = auVar89._0_8_ ^ 0x8000000080000000;
  auVar72._8_4_ = auVar89._8_4_ ^ 0x80000000;
  auVar72._12_4_ = auVar89._12_4_ ^ 0x80000000;
  local_158._16_16_ = auVar72;
  local_158._0_16_ = auVar72;
  local_358 = vshufps_avx(ZEXT416(uVar61),ZEXT416(uVar61),0);
  local_368 = vshufps_avx(ZEXT416(uVar10),ZEXT416(uVar10),0);
  uVar66 = 0;
  fVar154 = *(float *)(ray + k * 4 + 0x30);
  _local_238 = vsubps_avx(auVar250,auVar16);
  _local_248 = vsubps_avx(auVar17,auVar250);
  _local_258 = vsubps_avx(auVar69,auVar17);
  _local_308 = vsubps_avx(_local_3b8,_local_3a8);
  _local_318 = vsubps_avx(_local_3f8,_local_3d8);
  _local_328 = vsubps_avx(_local_2f8,_local_3e8);
  auVar58._4_4_ = fVar244;
  auVar58._0_4_ = fVar300;
  auVar58._8_4_ = fVar246;
  auVar58._12_4_ = fVar256;
  _local_338 = vsubps_avx(auVar58,_local_3c8);
  local_5e8 = ZEXT816(0x3f80000000000000);
  local_2e8 = local_5e8;
  do {
    auVar89 = vshufps_avx(local_5e8,local_5e8,0x50);
    auVar302._8_4_ = 0x3f800000;
    auVar302._0_8_ = &DAT_3f8000003f800000;
    auVar302._12_4_ = 0x3f800000;
    auVar305._16_4_ = 0x3f800000;
    auVar305._0_16_ = auVar302;
    auVar305._20_4_ = 0x3f800000;
    auVar305._24_4_ = 0x3f800000;
    auVar305._28_4_ = 0x3f800000;
    auVar179 = vsubps_avx(auVar302,auVar89);
    fVar171 = auVar89._0_4_;
    fVar136 = auVar89._4_4_;
    fVar172 = auVar89._8_4_;
    fVar137 = auVar89._12_4_;
    fVar173 = auVar179._0_4_;
    fVar138 = auVar179._4_4_;
    fVar174 = auVar179._8_4_;
    fVar188 = auVar179._12_4_;
    auVar108._0_4_ = auVar237._0_4_ * fVar171 + fVar173 * fVar80;
    auVar108._4_4_ = auVar237._4_4_ * fVar136 + fVar138 * fVar101;
    auVar108._8_4_ = auVar237._0_4_ * fVar172 + fVar174 * fVar80;
    auVar108._12_4_ = auVar237._4_4_ * fVar137 + fVar188 * fVar101;
    auVar84._0_4_ = auVar225._0_4_ * fVar171 + fVar81 * fVar173;
    auVar84._4_4_ = auVar225._4_4_ * fVar136 + fVar102 * fVar138;
    auVar84._8_4_ = auVar225._0_4_ * fVar172 + fVar81 * fVar174;
    auVar84._12_4_ = auVar225._4_4_ * fVar137 + fVar102 * fVar188;
    auVar202._0_4_ = auVar83._0_4_ * fVar171 + auVar281._0_4_ * fVar173;
    auVar202._4_4_ = auVar83._4_4_ * fVar136 + auVar281._4_4_ * fVar138;
    auVar202._8_4_ = auVar83._0_4_ * fVar172 + auVar281._0_4_ * fVar174;
    auVar202._12_4_ = auVar83._4_4_ * fVar137 + auVar281._4_4_ * fVar188;
    auVar123._0_4_ = auVar71._0_4_ * fVar171 + auVar263._0_4_ * fVar173;
    auVar123._4_4_ = auVar71._4_4_ * fVar136 + auVar263._4_4_ * fVar138;
    auVar123._8_4_ = auVar71._0_4_ * fVar172 + auVar263._0_4_ * fVar174;
    auVar123._12_4_ = auVar71._4_4_ * fVar137 + auVar263._4_4_ * fVar188;
    auVar89 = vmovshdup_avx(local_2e8);
    auVar179 = vshufps_avx(local_2e8,local_2e8,0);
    auVar217._16_16_ = auVar179;
    auVar217._0_16_ = auVar179;
    auVar169 = vshufps_avx(local_2e8,local_2e8,0x55);
    auVar77._16_16_ = auVar169;
    auVar77._0_16_ = auVar169;
    auVar76 = vsubps_avx(auVar77,auVar217);
    auVar169 = vshufps_avx(auVar108,auVar108,0);
    auVar70 = vshufps_avx(auVar108,auVar108,0x55);
    auVar88 = vshufps_avx(auVar84,auVar84,0);
    auVar68 = vshufps_avx(auVar84,auVar84,0x55);
    auVar73 = vshufps_avx(auVar202,auVar202,0);
    auVar110 = vshufps_avx(auVar202,auVar202,0x55);
    auVar103 = vshufps_avx(auVar123,auVar123,0);
    auVar104 = vshufps_avx(auVar123,auVar123,0x55);
    auVar89 = ZEXT416((uint)((auVar89._0_4_ - local_2e8._0_4_) * 0.04761905));
    auVar89 = vshufps_avx(auVar89,auVar89,0);
    auVar234._0_4_ = auVar179._0_4_ + auVar76._0_4_ * 0.0;
    auVar234._4_4_ = auVar179._4_4_ + auVar76._4_4_ * 0.14285715;
    auVar234._8_4_ = auVar179._8_4_ + auVar76._8_4_ * 0.2857143;
    auVar234._12_4_ = auVar179._12_4_ + auVar76._12_4_ * 0.42857146;
    auVar234._16_4_ = auVar179._0_4_ + auVar76._16_4_ * 0.5714286;
    auVar234._20_4_ = auVar179._4_4_ + auVar76._20_4_ * 0.71428573;
    auVar234._24_4_ = auVar179._8_4_ + auVar76._24_4_ * 0.8571429;
    auVar234._28_4_ = auVar179._12_4_ + auVar76._28_4_;
    auVar20 = vsubps_avx(auVar305,auVar234);
    fVar247 = auVar88._0_4_;
    fVar258 = auVar88._4_4_;
    fVar279 = auVar88._8_4_;
    fVar287 = auVar88._12_4_;
    fVar171 = auVar20._0_4_;
    fVar173 = auVar20._4_4_;
    fVar190 = auVar20._8_4_;
    fVar245 = auVar20._12_4_;
    fVar289 = auVar169._12_4_;
    fVar260 = auVar20._16_4_;
    fVar266 = auVar20._20_4_;
    fVar268 = auVar20._24_4_;
    fVar189 = auVar68._0_4_;
    fVar192 = auVar68._4_4_;
    fVar193 = auVar68._8_4_;
    fVar278 = auVar68._12_4_;
    local_598._0_4_ = auVar70._0_4_;
    local_598._4_4_ = auVar70._4_4_;
    fStack_590 = auVar70._8_4_;
    fStack_58c = auVar70._12_4_;
    fVar136 = auVar73._0_4_;
    fVar137 = auVar73._4_4_;
    fVar174 = auVar73._8_4_;
    fVar191 = auVar73._12_4_;
    fVar257 = auVar234._0_4_ * fVar136 + fVar247 * fVar171;
    fVar270 = auVar234._4_4_ * fVar137 + fVar258 * fVar173;
    fVar286 = auVar234._8_4_ * fVar174 + fVar279 * fVar190;
    fVar288 = auVar234._12_4_ * fVar191 + fVar287 * fVar245;
    fVar291 = auVar234._16_4_ * fVar136 + fVar247 * fVar260;
    fVar296 = auVar234._20_4_ * fVar137 + fVar258 * fVar266;
    fVar259 = auVar234._24_4_ * fVar174 + fVar279 * fVar268;
    fVar172 = auVar110._0_4_;
    fVar138 = auVar110._4_4_;
    fVar188 = auVar110._8_4_;
    fVar298 = auVar110._12_4_;
    fVar261 = auVar234._0_4_ * fVar172 + fVar189 * fVar171;
    fVar267 = auVar234._4_4_ * fVar138 + fVar192 * fVar173;
    fVar269 = auVar234._8_4_ * fVar188 + fVar193 * fVar190;
    fVar271 = auVar234._12_4_ * fVar298 + fVar278 * fVar245;
    fVar272 = auVar234._16_4_ * fVar172 + fVar189 * fVar260;
    fVar274 = auVar234._20_4_ * fVar138 + fVar192 * fVar266;
    fVar276 = auVar234._24_4_ * fVar188 + fVar193 * fVar268;
    auVar179 = vshufps_avx(auVar108,auVar108,0xaa);
    auVar70 = vshufps_avx(auVar108,auVar108,0xff);
    fVar235 = fVar191 + 0.0;
    auVar88 = vshufps_avx(auVar84,auVar84,0xaa);
    auVar68 = vshufps_avx(auVar84,auVar84,0xff);
    auVar78._0_4_ =
         fVar171 * (fVar247 * auVar234._0_4_ + auVar169._0_4_ * fVar171) + auVar234._0_4_ * fVar257;
    auVar78._4_4_ =
         fVar173 * (fVar258 * auVar234._4_4_ + auVar169._4_4_ * fVar173) + auVar234._4_4_ * fVar270;
    auVar78._8_4_ =
         fVar190 * (fVar279 * auVar234._8_4_ + auVar169._8_4_ * fVar190) + auVar234._8_4_ * fVar286;
    auVar78._12_4_ =
         fVar245 * (fVar287 * auVar234._12_4_ + fVar289 * fVar245) + auVar234._12_4_ * fVar288;
    auVar78._16_4_ =
         fVar260 * (fVar247 * auVar234._16_4_ + auVar169._0_4_ * fVar260) +
         auVar234._16_4_ * fVar291;
    auVar78._20_4_ =
         fVar266 * (fVar258 * auVar234._20_4_ + auVar169._4_4_ * fVar266) +
         auVar234._20_4_ * fVar296;
    auVar78._24_4_ =
         fVar268 * (fVar279 * auVar234._24_4_ + auVar169._8_4_ * fVar268) +
         auVar234._24_4_ * fVar259;
    auVar78._28_4_ = fVar289 + 1.0 + fVar298;
    auVar132._0_4_ =
         fVar171 * (fVar189 * auVar234._0_4_ + fVar171 * (float)local_598._0_4_) +
         auVar234._0_4_ * fVar261;
    auVar132._4_4_ =
         fVar173 * (fVar192 * auVar234._4_4_ + fVar173 * (float)local_598._4_4_) +
         auVar234._4_4_ * fVar267;
    auVar132._8_4_ =
         fVar190 * (fVar193 * auVar234._8_4_ + fVar190 * fStack_590) + auVar234._8_4_ * fVar269;
    auVar132._12_4_ =
         fVar245 * (fVar278 * auVar234._12_4_ + fVar245 * fStack_58c) + auVar234._12_4_ * fVar271;
    auVar132._16_4_ =
         fVar260 * (fVar189 * auVar234._16_4_ + fVar260 * (float)local_598._0_4_) +
         auVar234._16_4_ * fVar272;
    auVar132._20_4_ =
         fVar266 * (fVar192 * auVar234._20_4_ + fVar266 * (float)local_598._4_4_) +
         auVar234._20_4_ * fVar274;
    auVar132._24_4_ =
         fVar268 * (fVar193 * auVar234._24_4_ + fVar268 * fStack_590) + auVar234._24_4_ * fVar276;
    auVar132._28_4_ = fVar289 + 1.0 + fVar298;
    auVar151._0_4_ =
         fVar171 * fVar257 + auVar234._0_4_ * (auVar103._0_4_ * auVar234._0_4_ + fVar171 * fVar136);
    auVar151._4_4_ =
         fVar173 * fVar270 + auVar234._4_4_ * (auVar103._4_4_ * auVar234._4_4_ + fVar173 * fVar137);
    auVar151._8_4_ =
         fVar190 * fVar286 + auVar234._8_4_ * (auVar103._8_4_ * auVar234._8_4_ + fVar190 * fVar174);
    auVar151._12_4_ =
         fVar245 * fVar288 +
         auVar234._12_4_ * (auVar103._12_4_ * auVar234._12_4_ + fVar245 * fVar191);
    auVar151._16_4_ =
         fVar260 * fVar291 +
         auVar234._16_4_ * (auVar103._0_4_ * auVar234._16_4_ + fVar260 * fVar136);
    auVar151._20_4_ =
         fVar266 * fVar296 +
         auVar234._20_4_ * (auVar103._4_4_ * auVar234._20_4_ + fVar266 * fVar137);
    auVar151._24_4_ =
         fVar268 * fVar259 +
         auVar234._24_4_ * (auVar103._8_4_ * auVar234._24_4_ + fVar268 * fVar174);
    auVar151._28_4_ = fVar298 + fVar235;
    auVar243._0_4_ =
         fVar171 * fVar261 + auVar234._0_4_ * (auVar104._0_4_ * auVar234._0_4_ + fVar171 * fVar172);
    auVar243._4_4_ =
         fVar173 * fVar267 + auVar234._4_4_ * (auVar104._4_4_ * auVar234._4_4_ + fVar173 * fVar138);
    auVar243._8_4_ =
         fVar190 * fVar269 + auVar234._8_4_ * (auVar104._8_4_ * auVar234._8_4_ + fVar190 * fVar188);
    auVar243._12_4_ =
         fVar245 * fVar271 +
         auVar234._12_4_ * (auVar104._12_4_ * auVar234._12_4_ + fVar245 * fVar298);
    auVar243._16_4_ =
         fVar260 * fVar272 +
         auVar234._16_4_ * (auVar104._0_4_ * auVar234._16_4_ + fVar260 * fVar172);
    auVar243._20_4_ =
         fVar266 * fVar274 +
         auVar234._20_4_ * (auVar104._4_4_ * auVar234._20_4_ + fVar266 * fVar138);
    auVar243._24_4_ =
         fVar268 * fVar276 +
         auVar234._24_4_ * (auVar104._8_4_ * auVar234._24_4_ + fVar268 * fVar188);
    auVar243._28_4_ = fVar235 + fVar298 + 0.0;
    local_78._0_4_ = fVar171 * auVar78._0_4_ + auVar234._0_4_ * auVar151._0_4_;
    local_78._4_4_ = fVar173 * auVar78._4_4_ + auVar234._4_4_ * auVar151._4_4_;
    local_78._8_4_ = fVar190 * auVar78._8_4_ + auVar234._8_4_ * auVar151._8_4_;
    local_78._12_4_ = fVar245 * auVar78._12_4_ + auVar234._12_4_ * auVar151._12_4_;
    local_78._16_4_ = fVar260 * auVar78._16_4_ + auVar234._16_4_ * auVar151._16_4_;
    local_78._20_4_ = fVar266 * auVar78._20_4_ + auVar234._20_4_ * auVar151._20_4_;
    local_78._24_4_ = fVar268 * auVar78._24_4_ + auVar234._24_4_ * auVar151._24_4_;
    local_78._28_4_ = fVar289 + fVar287 + fVar298 + 0.0;
    local_98._0_4_ = fVar171 * auVar132._0_4_ + auVar234._0_4_ * auVar243._0_4_;
    local_98._4_4_ = fVar173 * auVar132._4_4_ + auVar234._4_4_ * auVar243._4_4_;
    local_98._8_4_ = fVar190 * auVar132._8_4_ + auVar234._8_4_ * auVar243._8_4_;
    local_98._12_4_ = fVar245 * auVar132._12_4_ + auVar234._12_4_ * auVar243._12_4_;
    local_98._16_4_ = fVar260 * auVar132._16_4_ + auVar234._16_4_ * auVar243._16_4_;
    local_98._20_4_ = fVar266 * auVar132._20_4_ + auVar234._20_4_ * auVar243._20_4_;
    local_98._24_4_ = fVar268 * auVar132._24_4_ + auVar234._24_4_ * auVar243._24_4_;
    local_98._28_4_ = fVar289 + fVar287 + fVar235;
    auVar21 = vsubps_avx(auVar151,auVar78);
    auVar76 = vsubps_avx(auVar243,auVar132);
    local_558 = auVar89._0_4_;
    fStack_554 = auVar89._4_4_;
    fStack_550 = auVar89._8_4_;
    fStack_54c = auVar89._12_4_;
    local_d8 = local_558 * auVar21._0_4_ * 3.0;
    fStack_d4 = fStack_554 * auVar21._4_4_ * 3.0;
    auVar22._4_4_ = fStack_d4;
    auVar22._0_4_ = local_d8;
    fStack_d0 = fStack_550 * auVar21._8_4_ * 3.0;
    auVar22._8_4_ = fStack_d0;
    fStack_cc = fStack_54c * auVar21._12_4_ * 3.0;
    auVar22._12_4_ = fStack_cc;
    fStack_c8 = local_558 * auVar21._16_4_ * 3.0;
    auVar22._16_4_ = fStack_c8;
    fStack_c4 = fStack_554 * auVar21._20_4_ * 3.0;
    auVar22._20_4_ = fStack_c4;
    fStack_c0 = fStack_550 * auVar21._24_4_ * 3.0;
    auVar22._24_4_ = fStack_c0;
    auVar22._28_4_ = auVar21._28_4_;
    fVar270 = local_558 * auVar76._0_4_ * 3.0;
    fVar279 = fStack_554 * auVar76._4_4_ * 3.0;
    auVar23._4_4_ = fVar279;
    auVar23._0_4_ = fVar270;
    fVar286 = fStack_550 * auVar76._8_4_ * 3.0;
    auVar23._8_4_ = fVar286;
    fVar287 = fStack_54c * auVar76._12_4_ * 3.0;
    auVar23._12_4_ = fVar287;
    fVar288 = local_558 * auVar76._16_4_ * 3.0;
    auVar23._16_4_ = fVar288;
    fVar291 = fStack_554 * auVar76._20_4_ * 3.0;
    auVar23._20_4_ = fVar291;
    fVar296 = fStack_550 * auVar76._24_4_ * 3.0;
    auVar23._24_4_ = fVar296;
    auVar23._28_4_ = auVar151._28_4_;
    auVar22 = vsubps_avx(local_78,auVar22);
    auVar76 = vperm2f128_avx(auVar22,auVar22,1);
    auVar76 = vshufps_avx(auVar76,auVar22,0x30);
    auVar76 = vshufps_avx(auVar22,auVar76,0x29);
    auVar23 = vsubps_avx(local_98,auVar23);
    auVar22 = vperm2f128_avx(auVar23,auVar23,1);
    auVar22 = vshufps_avx(auVar22,auVar23,0x30);
    auVar77 = vshufps_avx(auVar23,auVar22,0x29);
    fVar292 = auVar88._0_4_;
    fVar297 = auVar88._4_4_;
    fVar299 = auVar88._8_4_;
    fVar136 = auVar68._0_4_;
    fVar138 = auVar68._4_4_;
    fVar191 = auVar68._8_4_;
    fVar247 = auVar68._12_4_;
    fVar290 = auVar70._12_4_;
    auVar89 = vshufps_avx(auVar202,auVar202,0xaa);
    fVar172 = auVar89._0_4_;
    fVar174 = auVar89._4_4_;
    fVar298 = auVar89._8_4_;
    fVar257 = auVar89._12_4_;
    fVar271 = auVar234._0_4_ * fVar172 + fVar292 * fVar171;
    fVar272 = auVar234._4_4_ * fVar174 + fVar297 * fVar173;
    fVar274 = auVar234._8_4_ * fVar298 + fVar299 * fVar190;
    fVar276 = auVar234._12_4_ * fVar257 + auVar88._12_4_ * fVar245;
    fVar273 = auVar234._16_4_ * fVar172 + fVar292 * fVar260;
    fVar275 = auVar234._20_4_ * fVar174 + fVar297 * fVar266;
    fVar277 = auVar234._24_4_ * fVar298 + fVar299 * fVar268;
    fVar278 = fVar290 + fVar289 + fVar278;
    auVar89 = vshufps_avx(auVar202,auVar202,0xff);
    fVar137 = auVar89._0_4_;
    fVar188 = auVar89._4_4_;
    fVar235 = auVar89._8_4_;
    fVar258 = auVar89._12_4_;
    fVar259 = auVar234._0_4_ * fVar137 + fVar171 * fVar136;
    fVar189 = auVar234._4_4_ * fVar188 + fVar173 * fVar138;
    fVar261 = auVar234._8_4_ * fVar235 + fVar190 * fVar191;
    fVar192 = auVar234._12_4_ * fVar258 + fVar245 * fVar247;
    fVar267 = auVar234._16_4_ * fVar137 + fVar260 * fVar136;
    fVar193 = auVar234._20_4_ * fVar188 + fVar266 * fVar138;
    fVar269 = auVar234._24_4_ * fVar235 + fVar268 * fVar191;
    auVar89 = vshufps_avx(auVar123,auVar123,0xaa);
    auVar169 = vshufps_avx(auVar123,auVar123,0xff);
    fVar289 = auVar169._12_4_;
    auVar79._0_4_ =
         auVar234._0_4_ * fVar271 + fVar171 * (fVar292 * auVar234._0_4_ + auVar179._0_4_ * fVar171);
    auVar79._4_4_ =
         auVar234._4_4_ * fVar272 + fVar173 * (fVar297 * auVar234._4_4_ + auVar179._4_4_ * fVar173);
    auVar79._8_4_ =
         auVar234._8_4_ * fVar274 + fVar190 * (fVar299 * auVar234._8_4_ + auVar179._8_4_ * fVar190);
    auVar79._12_4_ =
         auVar234._12_4_ * fVar276 +
         fVar245 * (auVar88._12_4_ * auVar234._12_4_ + auVar179._12_4_ * fVar245);
    auVar79._16_4_ =
         auVar234._16_4_ * fVar273 +
         fVar260 * (fVar292 * auVar234._16_4_ + auVar179._0_4_ * fVar260);
    auVar79._20_4_ =
         auVar234._20_4_ * fVar275 +
         fVar266 * (fVar297 * auVar234._20_4_ + auVar179._4_4_ * fVar266);
    auVar79._24_4_ =
         auVar234._24_4_ * fVar277 +
         fVar268 * (fVar299 * auVar234._24_4_ + auVar179._8_4_ * fVar268);
    auVar79._28_4_ = fVar289 + auVar23._28_4_ + auVar22._28_4_;
    auVar285._0_4_ =
         auVar234._0_4_ * fVar259 + fVar171 * (auVar234._0_4_ * fVar136 + auVar70._0_4_ * fVar171);
    auVar285._4_4_ =
         auVar234._4_4_ * fVar189 + fVar173 * (auVar234._4_4_ * fVar138 + auVar70._4_4_ * fVar173);
    auVar285._8_4_ =
         auVar234._8_4_ * fVar261 + fVar190 * (auVar234._8_4_ * fVar191 + auVar70._8_4_ * fVar190);
    auVar285._12_4_ =
         auVar234._12_4_ * fVar192 + fVar245 * (auVar234._12_4_ * fVar247 + fVar290 * fVar245);
    auVar285._16_4_ =
         auVar234._16_4_ * fVar267 + fVar260 * (auVar234._16_4_ * fVar136 + auVar70._0_4_ * fVar260)
    ;
    auVar285._20_4_ =
         auVar234._20_4_ * fVar193 + fVar266 * (auVar234._20_4_ * fVar138 + auVar70._4_4_ * fVar266)
    ;
    auVar285._24_4_ =
         auVar234._24_4_ * fVar269 + fVar268 * (auVar234._24_4_ * fVar191 + auVar70._8_4_ * fVar268)
    ;
    auVar285._28_4_ = fVar289 + auVar22._28_4_ + auVar151._28_4_;
    auVar22 = vperm2f128_avx(local_78,local_78,1);
    auVar22 = vshufps_avx(auVar22,local_78,0x30);
    _local_398 = vshufps_avx(local_78,auVar22,0x29);
    auVar152._0_4_ =
         fVar171 * fVar271 + auVar234._0_4_ * (auVar89._0_4_ * auVar234._0_4_ + fVar171 * fVar172);
    auVar152._4_4_ =
         fVar173 * fVar272 + auVar234._4_4_ * (auVar89._4_4_ * auVar234._4_4_ + fVar173 * fVar174);
    auVar152._8_4_ =
         fVar190 * fVar274 + auVar234._8_4_ * (auVar89._8_4_ * auVar234._8_4_ + fVar190 * fVar298);
    auVar152._12_4_ =
         fVar245 * fVar276 +
         auVar234._12_4_ * (auVar89._12_4_ * auVar234._12_4_ + fVar245 * fVar257);
    auVar152._16_4_ =
         fVar260 * fVar273 + auVar234._16_4_ * (auVar89._0_4_ * auVar234._16_4_ + fVar260 * fVar172)
    ;
    auVar152._20_4_ =
         fVar266 * fVar275 + auVar234._20_4_ * (auVar89._4_4_ * auVar234._20_4_ + fVar266 * fVar174)
    ;
    auVar152._24_4_ =
         fVar268 * fVar277 + auVar234._24_4_ * (auVar89._8_4_ * auVar234._24_4_ + fVar268 * fVar298)
    ;
    auVar152._28_4_ = fVar278 + auVar89._12_4_ + fVar257;
    auVar187._0_4_ =
         fVar171 * fVar259 + auVar234._0_4_ * (auVar169._0_4_ * auVar234._0_4_ + fVar171 * fVar137);
    auVar187._4_4_ =
         fVar173 * fVar189 + auVar234._4_4_ * (auVar169._4_4_ * auVar234._4_4_ + fVar173 * fVar188);
    auVar187._8_4_ =
         fVar190 * fVar261 + auVar234._8_4_ * (auVar169._8_4_ * auVar234._8_4_ + fVar190 * fVar235);
    auVar187._12_4_ =
         fVar245 * fVar192 + auVar234._12_4_ * (fVar289 * auVar234._12_4_ + fVar245 * fVar258);
    auVar187._16_4_ =
         fVar260 * fVar267 +
         auVar234._16_4_ * (auVar169._0_4_ * auVar234._16_4_ + fVar260 * fVar137);
    auVar187._20_4_ =
         fVar266 * fVar193 +
         auVar234._20_4_ * (auVar169._4_4_ * auVar234._20_4_ + fVar266 * fVar188);
    auVar187._24_4_ =
         fVar268 * fVar269 +
         auVar234._24_4_ * (auVar169._8_4_ * auVar234._24_4_ + fVar268 * fVar235);
    auVar187._28_4_ = fVar290 + fVar247 + fVar289 + fVar258;
    auVar206._0_4_ = fVar171 * auVar79._0_4_ + auVar234._0_4_ * auVar152._0_4_;
    auVar206._4_4_ = fVar173 * auVar79._4_4_ + auVar234._4_4_ * auVar152._4_4_;
    auVar206._8_4_ = fVar190 * auVar79._8_4_ + auVar234._8_4_ * auVar152._8_4_;
    auVar206._12_4_ = fVar245 * auVar79._12_4_ + auVar234._12_4_ * auVar152._12_4_;
    auVar206._16_4_ = fVar260 * auVar79._16_4_ + auVar234._16_4_ * auVar152._16_4_;
    auVar206._20_4_ = fVar266 * auVar79._20_4_ + auVar234._20_4_ * auVar152._20_4_;
    auVar206._24_4_ = fVar268 * auVar79._24_4_ + auVar234._24_4_ * auVar152._24_4_;
    auVar206._28_4_ = fVar278 + fVar289 + fVar258;
    auVar218._0_4_ = fVar171 * auVar285._0_4_ + auVar234._0_4_ * auVar187._0_4_;
    auVar218._4_4_ = fVar173 * auVar285._4_4_ + auVar234._4_4_ * auVar187._4_4_;
    auVar218._8_4_ = fVar190 * auVar285._8_4_ + auVar234._8_4_ * auVar187._8_4_;
    auVar218._12_4_ = fVar245 * auVar285._12_4_ + auVar234._12_4_ * auVar187._12_4_;
    auVar218._16_4_ = fVar260 * auVar285._16_4_ + auVar234._16_4_ * auVar187._16_4_;
    auVar218._20_4_ = fVar266 * auVar285._20_4_ + auVar234._20_4_ * auVar187._20_4_;
    auVar218._24_4_ = fVar268 * auVar285._24_4_ + auVar234._24_4_ * auVar187._24_4_;
    auVar218._28_4_ = auVar20._28_4_ + auVar234._28_4_;
    auVar22 = vsubps_avx(auVar152,auVar79);
    auVar20 = vsubps_avx(auVar187,auVar285);
    local_f8 = local_558 * auVar22._0_4_ * 3.0;
    fStack_f4 = fStack_554 * auVar22._4_4_ * 3.0;
    auVar18._4_4_ = fStack_f4;
    auVar18._0_4_ = local_f8;
    fStack_f0 = fStack_550 * auVar22._8_4_ * 3.0;
    auVar18._8_4_ = fStack_f0;
    fStack_ec = fStack_54c * auVar22._12_4_ * 3.0;
    auVar18._12_4_ = fStack_ec;
    fStack_e8 = local_558 * auVar22._16_4_ * 3.0;
    auVar18._16_4_ = fStack_e8;
    fStack_e4 = fStack_554 * auVar22._20_4_ * 3.0;
    auVar18._20_4_ = fStack_e4;
    fStack_e0 = fStack_550 * auVar22._24_4_ * 3.0;
    auVar18._24_4_ = fStack_e0;
    auVar18._28_4_ = auVar187._28_4_;
    local_118 = local_558 * auVar20._0_4_ * 3.0;
    fStack_114 = fStack_554 * auVar20._4_4_ * 3.0;
    auVar19._4_4_ = fStack_114;
    auVar19._0_4_ = local_118;
    fStack_110 = fStack_550 * auVar20._8_4_ * 3.0;
    auVar19._8_4_ = fStack_110;
    fStack_10c = fStack_54c * auVar20._12_4_ * 3.0;
    auVar19._12_4_ = fStack_10c;
    local_558 = local_558 * auVar20._16_4_ * 3.0;
    auVar19._16_4_ = local_558;
    fStack_554 = fStack_554 * auVar20._20_4_ * 3.0;
    auVar19._20_4_ = fStack_554;
    fStack_550 = fStack_550 * auVar20._24_4_ * 3.0;
    auVar19._24_4_ = fStack_550;
    auVar19._28_4_ = fStack_54c;
    auVar22 = vperm2f128_avx(auVar206,auVar206,1);
    auVar22 = vshufps_avx(auVar22,auVar206,0x30);
    auVar78 = vshufps_avx(auVar206,auVar22,0x29);
    auVar20 = vsubps_avx(auVar206,auVar18);
    auVar22 = vperm2f128_avx(auVar20,auVar20,1);
    auVar22 = vshufps_avx(auVar22,auVar20,0x30);
    auVar18 = vshufps_avx(auVar20,auVar22,0x29);
    auVar20 = vsubps_avx(auVar218,auVar19);
    auVar22 = vperm2f128_avx(auVar20,auVar20,1);
    auVar22 = vshufps_avx(auVar22,auVar20,0x30);
    auVar19 = vshufps_avx(auVar20,auVar22,0x29);
    auVar23 = vsubps_avx(auVar206,local_78);
    auVar24 = vsubps_avx(auVar78,_local_398);
    fVar171 = auVar24._0_4_ + auVar23._0_4_;
    fVar136 = auVar24._4_4_ + auVar23._4_4_;
    fVar172 = auVar24._8_4_ + auVar23._8_4_;
    fVar137 = auVar24._12_4_ + auVar23._12_4_;
    fVar173 = auVar24._16_4_ + auVar23._16_4_;
    fVar138 = auVar24._20_4_ + auVar23._20_4_;
    fVar174 = auVar24._24_4_ + auVar23._24_4_;
    auVar20 = vperm2f128_avx(local_98,local_98,1);
    auVar20 = vshufps_avx(auVar20,local_98,0x30);
    local_b8 = vshufps_avx(local_98,auVar20,0x29);
    auVar20 = vperm2f128_avx(auVar218,auVar218,1);
    auVar20 = vshufps_avx(auVar20,auVar218,0x30);
    auVar79 = vshufps_avx(auVar218,auVar20,0x29);
    auVar20 = vsubps_avx(auVar218,local_98);
    auVar132 = vsubps_avx(auVar79,local_b8);
    fVar188 = auVar20._0_4_ + auVar132._0_4_;
    fVar190 = auVar20._4_4_ + auVar132._4_4_;
    fVar191 = auVar20._8_4_ + auVar132._8_4_;
    fVar298 = auVar20._12_4_ + auVar132._12_4_;
    fVar235 = auVar20._16_4_ + auVar132._16_4_;
    fVar245 = auVar20._20_4_ + auVar132._20_4_;
    fVar247 = auVar20._24_4_ + auVar132._24_4_;
    fVar257 = auVar20._28_4_;
    auVar20._4_4_ = local_98._4_4_ * fVar136;
    auVar20._0_4_ = local_98._0_4_ * fVar171;
    auVar20._8_4_ = local_98._8_4_ * fVar172;
    auVar20._12_4_ = local_98._12_4_ * fVar137;
    auVar20._16_4_ = local_98._16_4_ * fVar173;
    auVar20._20_4_ = local_98._20_4_ * fVar138;
    auVar20._24_4_ = local_98._24_4_ * fVar174;
    auVar20._28_4_ = fVar257;
    auVar25._4_4_ = fVar190 * local_78._4_4_;
    auVar25._0_4_ = fVar188 * local_78._0_4_;
    auVar25._8_4_ = fVar191 * local_78._8_4_;
    auVar25._12_4_ = fVar298 * local_78._12_4_;
    auVar25._16_4_ = fVar235 * local_78._16_4_;
    auVar25._20_4_ = fVar245 * local_78._20_4_;
    auVar25._24_4_ = fVar247 * local_78._24_4_;
    auVar25._28_4_ = auVar22._28_4_;
    auVar20 = vsubps_avx(auVar20,auVar25);
    local_d8 = local_78._0_4_ + local_d8;
    fStack_d4 = local_78._4_4_ + fStack_d4;
    fStack_d0 = local_78._8_4_ + fStack_d0;
    fStack_cc = local_78._12_4_ + fStack_cc;
    fStack_c8 = local_78._16_4_ + fStack_c8;
    fStack_c4 = local_78._20_4_ + fStack_c4;
    fStack_c0 = local_78._24_4_ + fStack_c0;
    fStack_bc = local_78._28_4_ + auVar21._28_4_;
    fVar270 = local_98._0_4_ + fVar270;
    fVar279 = local_98._4_4_ + fVar279;
    fVar286 = local_98._8_4_ + fVar286;
    fVar287 = local_98._12_4_ + fVar287;
    fVar288 = local_98._16_4_ + fVar288;
    fVar291 = local_98._20_4_ + fVar291;
    fVar296 = local_98._24_4_ + fVar296;
    auVar21._4_4_ = fVar279 * fVar136;
    auVar21._0_4_ = fVar270 * fVar171;
    auVar21._8_4_ = fVar286 * fVar172;
    auVar21._12_4_ = fVar287 * fVar137;
    auVar21._16_4_ = fVar288 * fVar173;
    auVar21._20_4_ = fVar291 * fVar138;
    auVar21._24_4_ = fVar296 * fVar174;
    auVar21._28_4_ = fVar257;
    auVar26._4_4_ = fVar190 * fStack_d4;
    auVar26._0_4_ = fVar188 * local_d8;
    auVar26._8_4_ = fVar191 * fStack_d0;
    auVar26._12_4_ = fVar298 * fStack_cc;
    auVar26._16_4_ = fVar235 * fStack_c8;
    auVar26._20_4_ = fVar245 * fStack_c4;
    auVar26._24_4_ = fVar247 * fStack_c0;
    auVar26._28_4_ = fStack_bc;
    auVar21 = vsubps_avx(auVar21,auVar26);
    auVar27._4_4_ = auVar77._4_4_ * fVar136;
    auVar27._0_4_ = auVar77._0_4_ * fVar171;
    auVar27._8_4_ = auVar77._8_4_ * fVar172;
    auVar27._12_4_ = auVar77._12_4_ * fVar137;
    auVar27._16_4_ = auVar77._16_4_ * fVar173;
    auVar27._20_4_ = auVar77._20_4_ * fVar138;
    auVar27._24_4_ = auVar77._24_4_ * fVar174;
    auVar27._28_4_ = fVar257;
    local_598._0_4_ = auVar76._0_4_;
    local_598._4_4_ = auVar76._4_4_;
    fStack_590 = auVar76._8_4_;
    fStack_58c = auVar76._12_4_;
    fStack_588 = auVar76._16_4_;
    fStack_584 = auVar76._20_4_;
    fStack_580 = auVar76._24_4_;
    auVar28._4_4_ = fVar190 * (float)local_598._4_4_;
    auVar28._0_4_ = fVar188 * (float)local_598._0_4_;
    auVar28._8_4_ = fVar191 * fStack_590;
    auVar28._12_4_ = fVar298 * fStack_58c;
    auVar28._16_4_ = fVar235 * fStack_588;
    auVar28._20_4_ = fVar245 * fStack_584;
    auVar28._24_4_ = fVar247 * fStack_580;
    auVar28._28_4_ = 0x40400000;
    auVar25 = vsubps_avx(auVar27,auVar28);
    auVar29._4_4_ = local_b8._4_4_ * fVar136;
    auVar29._0_4_ = local_b8._0_4_ * fVar171;
    auVar29._8_4_ = local_b8._8_4_ * fVar172;
    auVar29._12_4_ = local_b8._12_4_ * fVar137;
    auVar29._16_4_ = local_b8._16_4_ * fVar173;
    auVar29._20_4_ = local_b8._20_4_ * fVar138;
    auVar29._24_4_ = local_b8._24_4_ * fVar174;
    auVar29._28_4_ = fVar257;
    auVar30._4_4_ = local_398._4_4_ * fVar190;
    auVar30._0_4_ = local_398._0_4_ * fVar188;
    auVar30._8_4_ = local_398._8_4_ * fVar191;
    auVar30._12_4_ = local_398._12_4_ * fVar298;
    auVar30._16_4_ = local_398._16_4_ * fVar235;
    auVar30._20_4_ = local_398._20_4_ * fVar245;
    auVar30._24_4_ = local_398._24_4_ * fVar247;
    auVar30._28_4_ = local_b8._28_4_;
    auVar26 = vsubps_avx(auVar29,auVar30);
    auVar31._4_4_ = auVar218._4_4_ * fVar136;
    auVar31._0_4_ = auVar218._0_4_ * fVar171;
    auVar31._8_4_ = auVar218._8_4_ * fVar172;
    auVar31._12_4_ = auVar218._12_4_ * fVar137;
    auVar31._16_4_ = auVar218._16_4_ * fVar173;
    auVar31._20_4_ = auVar218._20_4_ * fVar138;
    auVar31._24_4_ = auVar218._24_4_ * fVar174;
    auVar31._28_4_ = fVar257;
    auVar32._4_4_ = fVar190 * auVar206._4_4_;
    auVar32._0_4_ = fVar188 * auVar206._0_4_;
    auVar32._8_4_ = fVar191 * auVar206._8_4_;
    auVar32._12_4_ = fVar298 * auVar206._12_4_;
    auVar32._16_4_ = fVar235 * auVar206._16_4_;
    auVar32._20_4_ = fVar245 * auVar206._20_4_;
    auVar32._24_4_ = fVar247 * auVar206._24_4_;
    auVar32._28_4_ = auVar77._28_4_;
    auVar27 = vsubps_avx(auVar31,auVar32);
    local_f8 = auVar206._0_4_ + local_f8;
    fStack_f4 = auVar206._4_4_ + fStack_f4;
    fStack_f0 = auVar206._8_4_ + fStack_f0;
    fStack_ec = auVar206._12_4_ + fStack_ec;
    fStack_e8 = auVar206._16_4_ + fStack_e8;
    fStack_e4 = auVar206._20_4_ + fStack_e4;
    fStack_e0 = auVar206._24_4_ + fStack_e0;
    fStack_dc = auVar206._28_4_ + auVar187._28_4_;
    local_118 = auVar218._0_4_ + local_118;
    fStack_114 = auVar218._4_4_ + fStack_114;
    fStack_110 = auVar218._8_4_ + fStack_110;
    fStack_10c = auVar218._12_4_ + fStack_10c;
    fStack_108 = auVar218._16_4_ + local_558;
    fStack_104 = auVar218._20_4_ + fStack_554;
    fStack_100 = auVar218._24_4_ + fStack_550;
    fStack_fc = auVar218._28_4_ + fStack_54c;
    auVar33._4_4_ = fStack_114 * fVar136;
    auVar33._0_4_ = local_118 * fVar171;
    auVar33._8_4_ = fStack_110 * fVar172;
    auVar33._12_4_ = fStack_10c * fVar137;
    auVar33._16_4_ = fStack_108 * fVar173;
    auVar33._20_4_ = fStack_104 * fVar138;
    auVar33._24_4_ = fStack_100 * fVar174;
    auVar33._28_4_ = auVar218._28_4_ + fStack_54c;
    auVar34._4_4_ = fStack_f4 * fVar190;
    auVar34._0_4_ = local_f8 * fVar188;
    auVar34._8_4_ = fStack_f0 * fVar191;
    auVar34._12_4_ = fStack_ec * fVar298;
    auVar34._16_4_ = fStack_e8 * fVar235;
    auVar34._20_4_ = fStack_e4 * fVar245;
    auVar34._24_4_ = fStack_e0 * fVar247;
    auVar34._28_4_ = fStack_dc;
    auVar28 = vsubps_avx(auVar33,auVar34);
    auVar35._4_4_ = auVar19._4_4_ * fVar136;
    auVar35._0_4_ = auVar19._0_4_ * fVar171;
    auVar35._8_4_ = auVar19._8_4_ * fVar172;
    auVar35._12_4_ = auVar19._12_4_ * fVar137;
    auVar35._16_4_ = auVar19._16_4_ * fVar173;
    auVar35._20_4_ = auVar19._20_4_ * fVar138;
    auVar35._24_4_ = auVar19._24_4_ * fVar174;
    auVar35._28_4_ = fStack_dc;
    auVar36._4_4_ = fVar190 * auVar18._4_4_;
    auVar36._0_4_ = fVar188 * auVar18._0_4_;
    auVar36._8_4_ = fVar191 * auVar18._8_4_;
    auVar36._12_4_ = fVar298 * auVar18._12_4_;
    auVar36._16_4_ = fVar235 * auVar18._16_4_;
    auVar36._20_4_ = fVar245 * auVar18._20_4_;
    auVar36._24_4_ = fVar247 * auVar18._24_4_;
    auVar36._28_4_ = auVar18._28_4_;
    auVar29 = vsubps_avx(auVar35,auVar36);
    auVar37._4_4_ = auVar79._4_4_ * fVar136;
    auVar37._0_4_ = auVar79._0_4_ * fVar171;
    auVar37._8_4_ = auVar79._8_4_ * fVar172;
    auVar37._12_4_ = auVar79._12_4_ * fVar137;
    auVar37._16_4_ = auVar79._16_4_ * fVar173;
    auVar37._20_4_ = auVar79._20_4_ * fVar138;
    auVar37._24_4_ = auVar79._24_4_ * fVar174;
    auVar37._28_4_ = auVar24._28_4_ + auVar23._28_4_;
    auVar24._4_4_ = auVar78._4_4_ * fVar190;
    auVar24._0_4_ = auVar78._0_4_ * fVar188;
    auVar24._8_4_ = auVar78._8_4_ * fVar191;
    auVar24._12_4_ = auVar78._12_4_ * fVar298;
    auVar24._16_4_ = auVar78._16_4_ * fVar235;
    auVar24._20_4_ = auVar78._20_4_ * fVar245;
    auVar24._24_4_ = auVar78._24_4_ * fVar247;
    auVar24._28_4_ = fVar257 + auVar132._28_4_;
    auVar24 = vsubps_avx(auVar37,auVar24);
    auVar22 = vminps_avx(auVar20,auVar21);
    auVar76 = vmaxps_avx(auVar20,auVar21);
    auVar20 = vminps_avx(auVar25,auVar26);
    auVar20 = vminps_avx(auVar22,auVar20);
    auVar22 = vmaxps_avx(auVar25,auVar26);
    auVar76 = vmaxps_avx(auVar76,auVar22);
    auVar21 = vminps_avx(auVar27,auVar28);
    auVar22 = vmaxps_avx(auVar27,auVar28);
    auVar23 = vminps_avx(auVar29,auVar24);
    auVar21 = vminps_avx(auVar21,auVar23);
    auVar21 = vminps_avx(auVar20,auVar21);
    auVar20 = vmaxps_avx(auVar29,auVar24);
    auVar22 = vmaxps_avx(auVar22,auVar20);
    auVar22 = vmaxps_avx(auVar76,auVar22);
    auVar76 = vcmpps_avx(auVar21,local_138,2);
    auVar22 = vcmpps_avx(auVar22,local_158,5);
    auVar76 = vandps_avx(auVar22,auVar76);
    auVar22 = local_228 & auVar76;
    uVar62 = 0;
    if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar22 >> 0x7f,0) != '\0') ||
          (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar22 >> 0xbf,0) != '\0') ||
        (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar22[0x1f] < '\0')
    {
      auVar22 = vsubps_avx(_local_398,local_78);
      auVar20 = vsubps_avx(auVar78,auVar206);
      fVar136 = auVar22._0_4_ + auVar20._0_4_;
      fVar172 = auVar22._4_4_ + auVar20._4_4_;
      fVar137 = auVar22._8_4_ + auVar20._8_4_;
      fVar173 = auVar22._12_4_ + auVar20._12_4_;
      fVar138 = auVar22._16_4_ + auVar20._16_4_;
      fVar174 = auVar22._20_4_ + auVar20._20_4_;
      fVar188 = auVar22._24_4_ + auVar20._24_4_;
      auVar21 = vsubps_avx(local_b8,local_98);
      auVar23 = vsubps_avx(auVar79,auVar218);
      fVar190 = auVar21._0_4_ + auVar23._0_4_;
      fVar191 = auVar21._4_4_ + auVar23._4_4_;
      fVar298 = auVar21._8_4_ + auVar23._8_4_;
      fVar235 = auVar21._12_4_ + auVar23._12_4_;
      fVar245 = auVar21._16_4_ + auVar23._16_4_;
      fVar247 = auVar21._20_4_ + auVar23._20_4_;
      fVar257 = auVar21._24_4_ + auVar23._24_4_;
      fVar171 = auVar23._28_4_;
      auVar38._4_4_ = local_98._4_4_ * fVar172;
      auVar38._0_4_ = local_98._0_4_ * fVar136;
      auVar38._8_4_ = local_98._8_4_ * fVar137;
      auVar38._12_4_ = local_98._12_4_ * fVar173;
      auVar38._16_4_ = local_98._16_4_ * fVar138;
      auVar38._20_4_ = local_98._20_4_ * fVar174;
      auVar38._24_4_ = local_98._24_4_ * fVar188;
      auVar38._28_4_ = local_98._28_4_;
      auVar39._4_4_ = local_78._4_4_ * fVar191;
      auVar39._0_4_ = local_78._0_4_ * fVar190;
      auVar39._8_4_ = local_78._8_4_ * fVar298;
      auVar39._12_4_ = local_78._12_4_ * fVar235;
      auVar39._16_4_ = local_78._16_4_ * fVar245;
      auVar39._20_4_ = local_78._20_4_ * fVar247;
      auVar39._24_4_ = local_78._24_4_ * fVar257;
      auVar39._28_4_ = local_78._28_4_;
      auVar23 = vsubps_avx(auVar38,auVar39);
      auVar40._4_4_ = fVar279 * fVar172;
      auVar40._0_4_ = fVar270 * fVar136;
      auVar40._8_4_ = fVar286 * fVar137;
      auVar40._12_4_ = fVar287 * fVar173;
      auVar40._16_4_ = fVar288 * fVar138;
      auVar40._20_4_ = fVar291 * fVar174;
      auVar40._24_4_ = fVar296 * fVar188;
      auVar40._28_4_ = local_98._28_4_;
      auVar41._4_4_ = fVar191 * fStack_d4;
      auVar41._0_4_ = fVar190 * local_d8;
      auVar41._8_4_ = fVar298 * fStack_d0;
      auVar41._12_4_ = fVar235 * fStack_cc;
      auVar41._16_4_ = fVar245 * fStack_c8;
      auVar41._20_4_ = fVar247 * fStack_c4;
      auVar41._24_4_ = fVar257 * fStack_c0;
      auVar41._28_4_ = fVar171;
      auVar24 = vsubps_avx(auVar40,auVar41);
      auVar42._4_4_ = fVar172 * auVar77._4_4_;
      auVar42._0_4_ = fVar136 * auVar77._0_4_;
      auVar42._8_4_ = fVar137 * auVar77._8_4_;
      auVar42._12_4_ = fVar173 * auVar77._12_4_;
      auVar42._16_4_ = fVar138 * auVar77._16_4_;
      auVar42._20_4_ = fVar174 * auVar77._20_4_;
      auVar42._24_4_ = fVar188 * auVar77._24_4_;
      auVar42._28_4_ = fVar171;
      auVar43._4_4_ = fVar191 * (float)local_598._4_4_;
      auVar43._0_4_ = fVar190 * (float)local_598._0_4_;
      auVar43._8_4_ = fVar298 * fStack_590;
      auVar43._12_4_ = fVar235 * fStack_58c;
      auVar43._16_4_ = fVar245 * fStack_588;
      auVar43._20_4_ = fVar247 * fStack_584;
      auVar43._24_4_ = fVar257 * fStack_580;
      auVar43._28_4_ = local_98._28_4_ + auVar151._28_4_;
      auVar77 = vsubps_avx(auVar42,auVar43);
      auVar44._4_4_ = local_b8._4_4_ * fVar172;
      auVar44._0_4_ = local_b8._0_4_ * fVar136;
      auVar44._8_4_ = local_b8._8_4_ * fVar137;
      auVar44._12_4_ = local_b8._12_4_ * fVar173;
      auVar44._16_4_ = local_b8._16_4_ * fVar138;
      auVar44._20_4_ = local_b8._20_4_ * fVar174;
      auVar44._24_4_ = local_b8._24_4_ * fVar188;
      auVar44._28_4_ = local_98._28_4_ + auVar151._28_4_;
      auVar45._4_4_ = local_398._4_4_ * fVar191;
      auVar45._0_4_ = local_398._0_4_ * fVar190;
      auVar45._8_4_ = local_398._8_4_ * fVar298;
      auVar45._12_4_ = local_398._12_4_ * fVar235;
      auVar45._16_4_ = local_398._16_4_ * fVar245;
      auVar45._20_4_ = local_398._20_4_ * fVar247;
      uVar6 = local_398._28_4_;
      auVar45._24_4_ = local_398._24_4_ * fVar257;
      auVar45._28_4_ = uVar6;
      auVar132 = vsubps_avx(auVar44,auVar45);
      auVar46._4_4_ = auVar218._4_4_ * fVar172;
      auVar46._0_4_ = auVar218._0_4_ * fVar136;
      auVar46._8_4_ = auVar218._8_4_ * fVar137;
      auVar46._12_4_ = auVar218._12_4_ * fVar173;
      auVar46._16_4_ = auVar218._16_4_ * fVar138;
      auVar46._20_4_ = auVar218._20_4_ * fVar174;
      auVar46._24_4_ = auVar218._24_4_ * fVar188;
      auVar46._28_4_ = auVar218._28_4_;
      auVar47._4_4_ = auVar206._4_4_ * fVar191;
      auVar47._0_4_ = auVar206._0_4_ * fVar190;
      auVar47._8_4_ = auVar206._8_4_ * fVar298;
      auVar47._12_4_ = auVar206._12_4_ * fVar235;
      auVar47._16_4_ = auVar206._16_4_ * fVar245;
      auVar47._20_4_ = auVar206._20_4_ * fVar247;
      auVar47._24_4_ = auVar206._24_4_ * fVar257;
      auVar47._28_4_ = auVar206._28_4_;
      auVar25 = vsubps_avx(auVar46,auVar47);
      auVar48._4_4_ = fVar172 * fStack_114;
      auVar48._0_4_ = fVar136 * local_118;
      auVar48._8_4_ = fVar137 * fStack_110;
      auVar48._12_4_ = fVar173 * fStack_10c;
      auVar48._16_4_ = fVar138 * fStack_108;
      auVar48._20_4_ = fVar174 * fStack_104;
      auVar48._24_4_ = fVar188 * fStack_100;
      auVar48._28_4_ = auVar218._28_4_;
      auVar49._4_4_ = fVar191 * fStack_f4;
      auVar49._0_4_ = fVar190 * local_f8;
      auVar49._8_4_ = fVar298 * fStack_f0;
      auVar49._12_4_ = fVar235 * fStack_ec;
      auVar49._16_4_ = fVar245 * fStack_e8;
      auVar49._20_4_ = fVar247 * fStack_e4;
      auVar49._24_4_ = fVar257 * fStack_e0;
      auVar49._28_4_ = uVar6;
      auVar26 = vsubps_avx(auVar48,auVar49);
      auVar50._4_4_ = fVar172 * auVar19._4_4_;
      auVar50._0_4_ = fVar136 * auVar19._0_4_;
      auVar50._8_4_ = fVar137 * auVar19._8_4_;
      auVar50._12_4_ = fVar173 * auVar19._12_4_;
      auVar50._16_4_ = fVar138 * auVar19._16_4_;
      auVar50._20_4_ = fVar174 * auVar19._20_4_;
      auVar50._24_4_ = fVar188 * auVar19._24_4_;
      auVar50._28_4_ = uVar6;
      auVar51._4_4_ = fVar191 * auVar18._4_4_;
      auVar51._0_4_ = fVar190 * auVar18._0_4_;
      auVar51._8_4_ = fVar298 * auVar18._8_4_;
      auVar51._12_4_ = fVar235 * auVar18._12_4_;
      auVar51._16_4_ = fVar245 * auVar18._16_4_;
      auVar51._20_4_ = fVar247 * auVar18._20_4_;
      auVar51._24_4_ = fVar257 * auVar18._24_4_;
      auVar51._28_4_ = local_b8._28_4_;
      auVar18 = vsubps_avx(auVar50,auVar51);
      auVar52._4_4_ = auVar79._4_4_ * fVar172;
      auVar52._0_4_ = auVar79._0_4_ * fVar136;
      auVar52._8_4_ = auVar79._8_4_ * fVar137;
      auVar52._12_4_ = auVar79._12_4_ * fVar173;
      auVar52._16_4_ = auVar79._16_4_ * fVar138;
      auVar52._20_4_ = auVar79._20_4_ * fVar174;
      auVar52._24_4_ = auVar79._24_4_ * fVar188;
      auVar52._28_4_ = auVar22._28_4_ + auVar20._28_4_;
      auVar53._4_4_ = auVar78._4_4_ * fVar191;
      auVar53._0_4_ = auVar78._0_4_ * fVar190;
      auVar53._8_4_ = auVar78._8_4_ * fVar298;
      auVar53._12_4_ = auVar78._12_4_ * fVar235;
      auVar53._16_4_ = auVar78._16_4_ * fVar245;
      auVar53._20_4_ = auVar78._20_4_ * fVar247;
      auVar53._24_4_ = auVar78._24_4_ * fVar257;
      auVar53._28_4_ = auVar21._28_4_ + fVar171;
      auVar78 = vsubps_avx(auVar52,auVar53);
      auVar20 = vminps_avx(auVar23,auVar24);
      auVar22 = vmaxps_avx(auVar23,auVar24);
      auVar21 = vminps_avx(auVar77,auVar132);
      auVar21 = vminps_avx(auVar20,auVar21);
      auVar20 = vmaxps_avx(auVar77,auVar132);
      auVar22 = vmaxps_avx(auVar22,auVar20);
      auVar23 = vminps_avx(auVar25,auVar26);
      auVar20 = vmaxps_avx(auVar25,auVar26);
      auVar77 = vminps_avx(auVar18,auVar78);
      auVar23 = vminps_avx(auVar23,auVar77);
      auVar23 = vminps_avx(auVar21,auVar23);
      auVar21 = vmaxps_avx(auVar18,auVar78);
      auVar20 = vmaxps_avx(auVar20,auVar21);
      auVar20 = vmaxps_avx(auVar22,auVar20);
      auVar22 = vcmpps_avx(auVar23,local_138,2);
      auVar20 = vcmpps_avx(auVar20,local_158,5);
      auVar22 = vandps_avx(auVar20,auVar22);
      auVar76 = vandps_avx(auVar76,local_228);
      auVar20 = auVar76 & auVar22;
      if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar20 >> 0x7f,0) != '\0') ||
            (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar20 >> 0xbf,0) != '\0') ||
          (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar20[0x1f] < '\0') {
        auVar76 = vandps_avx(auVar22,auVar76);
        uVar62 = vmovmskps_avx(auVar76);
      }
    }
    if (uVar62 != 0) {
      auStack_378[uVar66] = uVar62;
      uVar7 = vmovlps_avx(local_2e8);
      *(undefined8 *)(afStack_208 + uVar66 * 2) = uVar7;
      uVar8 = vmovlps_avx(local_5e8);
      auStack_58[uVar66] = uVar8;
      uVar66 = (ulong)((int)uVar66 + 1);
    }
    auVar306 = ZEXT464(0) << 0x20;
    do {
      if ((int)uVar66 == 0) {
        uVar6 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar75._4_4_ = uVar6;
        auVar75._0_4_ = uVar6;
        auVar75._8_4_ = uVar6;
        auVar75._12_4_ = uVar6;
        auVar89 = vcmpps_avx(local_348,auVar75,2);
        uVar61 = vmovmskps_avx(auVar89);
        uVar61 = (uint)uVar67 & uVar61;
        if (uVar61 == 0) {
          return;
        }
        goto LAB_00ee050e;
      }
      uVar64 = (int)uVar66 - 1;
      uVar65 = (ulong)uVar64;
      uVar62 = auStack_378[uVar65];
      fVar171 = afStack_208[uVar65 * 2];
      fVar136 = afStack_208[uVar65 * 2 + 1];
      local_5e8._8_8_ = 0;
      local_5e8._0_8_ = auStack_58[uVar65];
      uVar8 = 0;
      if (uVar62 != 0) {
        for (; (uVar62 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
        }
      }
      uVar62 = uVar62 - 1 & uVar62;
      auStack_378[uVar65] = uVar62;
      if (uVar62 == 0) {
        uVar66 = (ulong)uVar64;
      }
      fVar137 = (float)(uVar8 + 1) * 0.14285715;
      fVar172 = (1.0 - (float)uVar8 * 0.14285715) * fVar171 + fVar136 * (float)uVar8 * 0.14285715;
      fVar171 = (1.0 - fVar137) * fVar171 + fVar136 * fVar137;
      fVar136 = fVar171 - fVar172;
      if (0.16666667 <= fVar136) break;
      auVar89 = vshufps_avx(local_5e8,local_5e8,0x50);
      auVar109._8_4_ = 0x3f800000;
      auVar109._0_8_ = &DAT_3f8000003f800000;
      auVar109._12_4_ = 0x3f800000;
      auVar179 = vsubps_avx(auVar109,auVar89);
      fVar137 = auVar89._0_4_;
      fVar173 = auVar89._4_4_;
      fVar138 = auVar89._8_4_;
      fVar174 = auVar89._12_4_;
      fVar188 = auVar179._0_4_;
      fVar190 = auVar179._4_4_;
      fVar191 = auVar179._8_4_;
      fVar298 = auVar179._12_4_;
      auVar124._0_4_ = auVar237._0_4_ * fVar137 + fVar188 * fVar80;
      auVar124._4_4_ = auVar237._4_4_ * fVar173 + fVar190 * fVar101;
      auVar124._8_4_ = auVar237._0_4_ * fVar138 + fVar191 * fVar80;
      auVar124._12_4_ = auVar237._4_4_ * fVar174 + fVar298 * fVar101;
      auVar143._0_4_ = auVar225._0_4_ * fVar137 + fVar188 * fVar81;
      auVar143._4_4_ = auVar225._4_4_ * fVar173 + fVar190 * fVar102;
      auVar143._8_4_ = auVar225._0_4_ * fVar138 + fVar191 * fVar81;
      auVar143._12_4_ = auVar225._4_4_ * fVar174 + fVar298 * fVar102;
      auVar162._0_4_ = auVar83._0_4_ * fVar137 + auVar281._0_4_ * fVar188;
      auVar162._4_4_ = auVar83._4_4_ * fVar173 + auVar281._4_4_ * fVar190;
      auVar162._8_4_ = auVar83._0_4_ * fVar138 + auVar281._0_4_ * fVar191;
      auVar162._12_4_ = auVar83._4_4_ * fVar174 + auVar281._4_4_ * fVar298;
      auVar85._0_4_ = auVar71._0_4_ * fVar137 + auVar263._0_4_ * fVar188;
      auVar85._4_4_ = auVar71._4_4_ * fVar173 + auVar263._4_4_ * fVar190;
      auVar85._8_4_ = auVar71._0_4_ * fVar138 + auVar263._0_4_ * fVar191;
      auVar85._12_4_ = auVar71._4_4_ * fVar174 + auVar263._4_4_ * fVar298;
      auVar115._16_16_ = auVar124;
      auVar115._0_16_ = auVar124;
      auVar133._16_16_ = auVar143;
      auVar133._0_16_ = auVar143;
      auVar153._16_16_ = auVar162;
      auVar153._0_16_ = auVar162;
      auVar76 = vshufps_avx(ZEXT2032(CONCAT416(fVar171,ZEXT416((uint)fVar172))),
                            ZEXT2032(CONCAT416(fVar171,ZEXT416((uint)fVar172))),0);
      auVar22 = vsubps_avx(auVar133,auVar115);
      fVar137 = auVar76._0_4_;
      fVar173 = auVar76._4_4_;
      fVar138 = auVar76._8_4_;
      fVar174 = auVar76._12_4_;
      fVar188 = auVar76._16_4_;
      fVar190 = auVar76._20_4_;
      fVar191 = auVar76._24_4_;
      auVar116._0_4_ = auVar124._0_4_ + auVar22._0_4_ * fVar137;
      auVar116._4_4_ = auVar124._4_4_ + auVar22._4_4_ * fVar173;
      auVar116._8_4_ = auVar124._8_4_ + auVar22._8_4_ * fVar138;
      auVar116._12_4_ = auVar124._12_4_ + auVar22._12_4_ * fVar174;
      auVar116._16_4_ = auVar124._0_4_ + auVar22._16_4_ * fVar188;
      auVar116._20_4_ = auVar124._4_4_ + auVar22._20_4_ * fVar190;
      auVar116._24_4_ = auVar124._8_4_ + auVar22._24_4_ * fVar191;
      auVar116._28_4_ = auVar124._12_4_ + auVar22._28_4_;
      auVar22 = vsubps_avx(auVar153,auVar133);
      auVar134._0_4_ = auVar143._0_4_ + auVar22._0_4_ * fVar137;
      auVar134._4_4_ = auVar143._4_4_ + auVar22._4_4_ * fVar173;
      auVar134._8_4_ = auVar143._8_4_ + auVar22._8_4_ * fVar138;
      auVar134._12_4_ = auVar143._12_4_ + auVar22._12_4_ * fVar174;
      auVar134._16_4_ = auVar143._0_4_ + auVar22._16_4_ * fVar188;
      auVar134._20_4_ = auVar143._4_4_ + auVar22._20_4_ * fVar190;
      auVar134._24_4_ = auVar143._8_4_ + auVar22._24_4_ * fVar191;
      auVar134._28_4_ = auVar143._12_4_ + auVar22._28_4_;
      auVar89 = vsubps_avx(auVar85,auVar162);
      auVar99._0_4_ = auVar162._0_4_ + auVar89._0_4_ * fVar137;
      auVar99._4_4_ = auVar162._4_4_ + auVar89._4_4_ * fVar173;
      auVar99._8_4_ = auVar162._8_4_ + auVar89._8_4_ * fVar138;
      auVar99._12_4_ = auVar162._12_4_ + auVar89._12_4_ * fVar174;
      auVar99._16_4_ = auVar162._0_4_ + auVar89._0_4_ * fVar188;
      auVar99._20_4_ = auVar162._4_4_ + auVar89._4_4_ * fVar190;
      auVar99._24_4_ = auVar162._8_4_ + auVar89._8_4_ * fVar191;
      auVar99._28_4_ = auVar162._12_4_ + auVar89._12_4_;
      auVar22 = vsubps_avx(auVar134,auVar116);
      auVar117._0_4_ = auVar116._0_4_ + fVar137 * auVar22._0_4_;
      auVar117._4_4_ = auVar116._4_4_ + fVar173 * auVar22._4_4_;
      auVar117._8_4_ = auVar116._8_4_ + fVar138 * auVar22._8_4_;
      auVar117._12_4_ = auVar116._12_4_ + fVar174 * auVar22._12_4_;
      auVar117._16_4_ = auVar116._16_4_ + fVar188 * auVar22._16_4_;
      auVar117._20_4_ = auVar116._20_4_ + fVar190 * auVar22._20_4_;
      auVar117._24_4_ = auVar116._24_4_ + fVar191 * auVar22._24_4_;
      auVar117._28_4_ = auVar116._28_4_ + auVar22._28_4_;
      auVar22 = vsubps_avx(auVar99,auVar134);
      auVar100._0_4_ = auVar134._0_4_ + fVar137 * auVar22._0_4_;
      auVar100._4_4_ = auVar134._4_4_ + fVar173 * auVar22._4_4_;
      auVar100._8_4_ = auVar134._8_4_ + fVar138 * auVar22._8_4_;
      auVar100._12_4_ = auVar134._12_4_ + fVar174 * auVar22._12_4_;
      auVar100._16_4_ = auVar134._16_4_ + fVar188 * auVar22._16_4_;
      auVar100._20_4_ = auVar134._20_4_ + fVar190 * auVar22._20_4_;
      auVar100._24_4_ = auVar134._24_4_ + fVar191 * auVar22._24_4_;
      auVar100._28_4_ = auVar134._28_4_ + auVar22._28_4_;
      auVar22 = vsubps_avx(auVar100,auVar117);
      auVar125._0_4_ = auVar117._0_4_ + fVar137 * auVar22._0_4_;
      auVar125._4_4_ = auVar117._4_4_ + fVar173 * auVar22._4_4_;
      auVar125._8_4_ = auVar117._8_4_ + fVar138 * auVar22._8_4_;
      auVar125._12_4_ = auVar117._12_4_ + fVar174 * auVar22._12_4_;
      auVar135._16_4_ = auVar117._16_4_ + fVar188 * auVar22._16_4_;
      auVar135._0_16_ = auVar125;
      auVar135._20_4_ = auVar117._20_4_ + fVar190 * auVar22._20_4_;
      auVar135._24_4_ = auVar117._24_4_ + fVar191 * auVar22._24_4_;
      auVar135._28_4_ = auVar117._28_4_ + auVar134._28_4_;
      fVar137 = auVar22._4_4_ * 3.0;
      auVar110 = auVar135._16_16_;
      auVar88 = vshufps_avx(ZEXT416((uint)(fVar136 * 0.33333334)),
                            ZEXT416((uint)(fVar136 * 0.33333334)),0);
      auVar226._0_4_ = auVar125._0_4_ + auVar88._0_4_ * auVar22._0_4_ * 3.0;
      auVar226._4_4_ = auVar125._4_4_ + auVar88._4_4_ * fVar137;
      auVar226._8_4_ = auVar125._8_4_ + auVar88._8_4_ * auVar22._8_4_ * 3.0;
      auVar226._12_4_ = auVar125._12_4_ + auVar88._12_4_ * auVar22._12_4_ * 3.0;
      auVar169 = vshufpd_avx(auVar125,auVar125,3);
      auVar70 = vshufpd_avx(auVar110,auVar110,3);
      _local_398 = auVar169;
      auVar89 = vsubps_avx(auVar169,auVar125);
      auVar179 = vsubps_avx(auVar70,auVar110);
      auVar86._0_4_ = auVar89._0_4_ + auVar179._0_4_;
      auVar86._4_4_ = auVar89._4_4_ + auVar179._4_4_;
      auVar86._8_4_ = auVar89._8_4_ + auVar179._8_4_;
      auVar86._12_4_ = auVar89._12_4_ + auVar179._12_4_;
      auVar89 = vmovshdup_avx(auVar125);
      auVar179 = vmovshdup_avx(auVar226);
      auVar68 = vshufps_avx(auVar86,auVar86,0);
      auVar73 = vshufps_avx(auVar86,auVar86,0x55);
      fVar190 = auVar73._0_4_;
      fVar191 = auVar73._4_4_;
      fVar298 = auVar73._8_4_;
      fVar235 = auVar73._12_4_;
      fVar173 = auVar68._0_4_;
      fVar138 = auVar68._4_4_;
      fVar174 = auVar68._8_4_;
      fVar188 = auVar68._12_4_;
      auVar211._0_4_ = fVar173 * auVar125._0_4_ + fVar190 * auVar89._0_4_;
      auVar211._4_4_ = fVar138 * auVar125._4_4_ + fVar191 * auVar89._4_4_;
      auVar211._8_4_ = fVar174 * auVar125._8_4_ + fVar298 * auVar89._8_4_;
      auVar211._12_4_ = fVar188 * auVar125._12_4_ + fVar235 * auVar89._12_4_;
      auVar227._0_4_ = auVar226._0_4_ * fVar173 + fVar190 * auVar179._0_4_;
      auVar227._4_4_ = auVar226._4_4_ * fVar138 + fVar191 * auVar179._4_4_;
      auVar227._8_4_ = auVar226._8_4_ * fVar174 + fVar298 * auVar179._8_4_;
      auVar227._12_4_ = auVar226._12_4_ * fVar188 + fVar235 * auVar179._12_4_;
      auVar179 = vshufps_avx(auVar211,auVar211,0xe8);
      auVar68 = vshufps_avx(auVar227,auVar227,0xe8);
      auVar89 = vcmpps_avx(auVar179,auVar68,1);
      uVar62 = vextractps_avx(auVar89,0);
      auVar73 = auVar227;
      if ((uVar62 & 1) == 0) {
        auVar73 = auVar211;
      }
      auVar87._0_4_ = auVar88._0_4_ * auVar22._16_4_ * 3.0;
      auVar87._4_4_ = auVar88._4_4_ * fVar137;
      auVar87._8_4_ = auVar88._8_4_ * auVar22._24_4_ * 3.0;
      auVar87._12_4_ = auVar88._12_4_ * auVar76._28_4_;
      auVar104 = vsubps_avx(auVar110,auVar87);
      auVar88 = vmovshdup_avx(auVar104);
      auVar110 = vmovshdup_avx(auVar110);
      fVar137 = auVar104._0_4_;
      fVar245 = auVar104._4_4_;
      auVar303._0_4_ = fVar173 * fVar137 + fVar190 * auVar88._0_4_;
      auVar303._4_4_ = fVar138 * fVar245 + fVar191 * auVar88._4_4_;
      auVar303._8_4_ = fVar174 * auVar104._8_4_ + fVar298 * auVar88._8_4_;
      auVar303._12_4_ = fVar188 * auVar104._12_4_ + fVar235 * auVar88._12_4_;
      auVar282._0_4_ = fVar173 * auVar135._16_4_ + fVar190 * auVar110._0_4_;
      auVar282._4_4_ = fVar138 * auVar135._20_4_ + fVar191 * auVar110._4_4_;
      auVar282._8_4_ = fVar174 * auVar135._24_4_ + fVar298 * auVar110._8_4_;
      auVar282._12_4_ = fVar188 * auVar135._28_4_ + fVar235 * auVar110._12_4_;
      auVar110 = vshufps_avx(auVar303,auVar303,0xe8);
      auVar103 = vshufps_avx(auVar282,auVar282,0xe8);
      auVar88 = vcmpps_avx(auVar110,auVar103,1);
      uVar62 = vextractps_avx(auVar88,0);
      auVar105 = auVar282;
      if ((uVar62 & 1) == 0) {
        auVar105 = auVar303;
      }
      auVar73 = vmaxss_avx(auVar105,auVar73);
      auVar179 = vminps_avx(auVar179,auVar68);
      auVar68 = vminps_avx(auVar110,auVar103);
      auVar68 = vminps_avx(auVar179,auVar68);
      auVar89 = vshufps_avx(auVar89,auVar89,0x55);
      auVar89 = vblendps_avx(auVar89,auVar88,2);
      auVar88 = vpslld_avx(auVar89,0x1f);
      auVar89 = vshufpd_avx(auVar227,auVar227,1);
      auVar89 = vinsertps_avx(auVar89,auVar282,0x9c);
      auVar179 = vshufpd_avx(auVar211,auVar211,1);
      auVar179 = vinsertps_avx(auVar179,auVar303,0x9c);
      auVar89 = vblendvps_avx(auVar179,auVar89,auVar88);
      auVar179 = vmovshdup_avx(auVar89);
      auVar89 = vmaxss_avx(auVar179,auVar89);
      fVar174 = auVar68._0_4_;
      auVar179 = vmovshdup_avx(auVar68);
      fVar138 = auVar89._0_4_;
      fVar188 = auVar179._0_4_;
      fVar173 = auVar73._0_4_;
      if ((0.0001 <= fVar174) || (fVar138 <= -0.0001)) {
        if ((-0.0001 < fVar173 && fVar188 < 0.0001) ||
           ((fVar174 < 0.0001 && -0.0001 < fVar173 || (fVar188 < 0.0001 && -0.0001 < fVar138))))
        goto LAB_00ee174b;
LAB_00ee21d9:
        bVar54 = true;
        auVar306 = ZEXT1664(ZEXT816(0) << 0x40);
      }
      else {
LAB_00ee174b:
        auVar306 = ZEXT464(0) << 0x20;
        auVar88 = vcmpps_avx(auVar68,ZEXT416(0) << 0x20,1);
        auVar179 = vcmpss_avx(auVar73,ZEXT416(0),1);
        auVar293._8_4_ = 0x3f800000;
        auVar293._0_8_ = &DAT_3f8000003f800000;
        auVar293._12_4_ = 0x3f800000;
        auVar163._8_4_ = 0xbf800000;
        auVar163._0_8_ = 0xbf800000bf800000;
        auVar163._12_4_ = 0xbf800000;
        auVar179 = vblendvps_avx(auVar293,auVar163,auVar179);
        auVar88 = vblendvps_avx(auVar293,auVar163,auVar88);
        auVar110 = vcmpss_avx(auVar179,auVar88,4);
        auVar110 = vpshufd_avx(ZEXT416(auVar110._0_4_ & 1),0x50);
        auVar110 = vpslld_avx(auVar110,0x1f);
        auVar110 = vpsrad_avx(auVar110,0x1f);
        auVar110 = vpandn_avx(auVar110,_DAT_02020eb0);
        auVar103 = vmovshdup_avx(auVar88);
        fVar190 = auVar103._0_4_;
        if ((auVar88._0_4_ != fVar190) || (NAN(auVar88._0_4_) || NAN(fVar190))) {
          if ((fVar188 != fVar174) || (NAN(fVar188) || NAN(fVar174))) {
            fVar174 = -fVar174 / (fVar188 - fVar174);
            auVar88 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar174) * 0.0 + fVar174)));
          }
          else {
            auVar88 = vcmpss_avx(auVar68,ZEXT416(0),0);
            auVar88 = vpshufd_avx(ZEXT416(auVar88._0_4_ & 1),0x50);
            auVar88 = vpslld_avx(auVar88,0x1f);
            auVar88 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar88);
          }
          auVar103 = vcmpps_avx(auVar110,auVar88,1);
          auVar68 = vblendps_avx(auVar110,auVar88,2);
          auVar88 = vblendps_avx(auVar88,auVar110,2);
          auVar110 = vblendvps_avx(auVar88,auVar68,auVar103);
        }
        auVar89 = vcmpss_avx(auVar89,ZEXT416(0),1);
        auVar111._8_4_ = 0xbf800000;
        auVar111._0_8_ = 0xbf800000bf800000;
        auVar111._12_4_ = 0xbf800000;
        auVar89 = vblendvps_avx(auVar293,auVar111,auVar89);
        fVar174 = auVar89._0_4_;
        if ((auVar179._0_4_ != fVar174) || (NAN(auVar179._0_4_) || NAN(fVar174))) {
          if ((fVar138 != fVar173) || (NAN(fVar138) || NAN(fVar173))) {
            fVar173 = -fVar173 / (fVar138 - fVar173);
            auVar89 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar173) * 0.0 + fVar173)));
          }
          else {
            auVar89 = vcmpss_avx(auVar73,ZEXT416(0),0);
            auVar89 = vpshufd_avx(ZEXT416(auVar89._0_4_ & 1),0x50);
            auVar89 = vpslld_avx(auVar89,0x1f);
            auVar89 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar89);
          }
          auVar88 = vcmpps_avx(auVar110,auVar89,1);
          auVar179 = vblendps_avx(auVar110,auVar89,2);
          auVar89 = vblendps_avx(auVar89,auVar110,2);
          auVar110 = vblendvps_avx(auVar89,auVar179,auVar88);
        }
        if ((fVar190 != fVar174) || (NAN(fVar190) || NAN(fVar174))) {
          auVar89 = vcmpps_avx(auVar110,auVar293,1);
          auVar179 = vinsertps_avx(auVar110,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar164._4_12_ = auVar110._4_12_;
          auVar164._0_4_ = 0x3f800000;
          auVar110 = vblendvps_avx(auVar164,auVar179,auVar89);
        }
        auVar89 = vcmpps_avx(auVar110,_DAT_01fec6f0,1);
        auVar55._12_4_ = 0;
        auVar55._0_12_ = auVar110._4_12_;
        auVar179 = vinsertps_avx(auVar110,ZEXT416(0x3f800000),0x10);
        auVar89 = vblendvps_avx(auVar179,auVar55 << 0x20,auVar89);
        auVar179 = vmovshdup_avx(auVar89);
        bVar54 = true;
        if (auVar89._0_4_ <= auVar179._0_4_) {
          auVar90._0_4_ = auVar89._0_4_ + -0.1;
          auVar90._4_4_ = auVar89._4_4_ + 0.1;
          auVar90._8_4_ = auVar89._8_4_ + 0.0;
          auVar90._12_4_ = auVar89._12_4_ + 0.0;
          auVar88 = vshufpd_avx(auVar226,auVar226,3);
          auVar126._8_8_ = 0x3f80000000000000;
          auVar126._0_8_ = 0x3f80000000000000;
          auVar89 = vcmpps_avx(auVar90,auVar126,1);
          auVar56._12_4_ = 0;
          auVar56._0_12_ = auVar90._4_12_;
          auVar179 = vinsertps_avx(auVar90,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar89 = vblendvps_avx(auVar179,auVar56 << 0x20,auVar89);
          auVar179 = vshufpd_avx(auVar104,auVar104,3);
          auVar68 = vshufps_avx(auVar89,auVar89,0x50);
          auVar73 = vsubps_avx(auVar293,auVar68);
          local_398._0_4_ = auVar169._0_4_;
          local_398._4_4_ = auVar169._4_4_;
          fStack_390 = auVar169._8_4_;
          fStack_38c = auVar169._12_4_;
          fVar173 = auVar68._0_4_;
          fVar138 = auVar68._4_4_;
          fVar174 = auVar68._8_4_;
          fVar188 = auVar68._12_4_;
          local_5b8 = auVar70._0_4_;
          fStack_5b4 = auVar70._4_4_;
          fStack_5b0 = auVar70._8_4_;
          fStack_5ac = auVar70._12_4_;
          fVar190 = auVar73._0_4_;
          fVar191 = auVar73._4_4_;
          fVar298 = auVar73._8_4_;
          fVar235 = auVar73._12_4_;
          auVar112._0_4_ = fVar173 * (float)local_398._0_4_ + fVar190 * auVar125._0_4_;
          auVar112._4_4_ = fVar138 * (float)local_398._4_4_ + fVar191 * auVar125._4_4_;
          auVar112._8_4_ = fVar174 * fStack_390 + fVar298 * auVar125._0_4_;
          auVar112._12_4_ = fVar188 * fStack_38c + fVar235 * auVar125._4_4_;
          auVar144._0_4_ = fVar173 * auVar88._0_4_ + fVar190 * auVar226._0_4_;
          auVar144._4_4_ = fVar138 * auVar88._4_4_ + fVar191 * auVar226._4_4_;
          auVar144._8_4_ = fVar174 * auVar88._8_4_ + fVar298 * auVar226._0_4_;
          auVar144._12_4_ = fVar188 * auVar88._12_4_ + fVar235 * auVar226._4_4_;
          auVar203._0_4_ = fVar173 * auVar179._0_4_ + fVar190 * fVar137;
          auVar203._4_4_ = fVar138 * auVar179._4_4_ + fVar191 * fVar245;
          auVar203._8_4_ = fVar174 * auVar179._8_4_ + fVar298 * fVar137;
          auVar203._12_4_ = fVar188 * auVar179._12_4_ + fVar235 * fVar245;
          auVar212._0_4_ = fVar173 * local_5b8 + fVar190 * auVar135._16_4_;
          auVar212._4_4_ = fVar138 * fStack_5b4 + fVar191 * auVar135._20_4_;
          auVar212._8_4_ = fVar174 * fStack_5b0 + fVar298 * auVar135._16_4_;
          auVar212._12_4_ = fVar188 * fStack_5ac + fVar235 * auVar135._20_4_;
          auVar70 = vsubps_avx(auVar293,auVar89);
          auVar179 = vmovshdup_avx(local_5e8);
          auVar169 = vmovsldup_avx(local_5e8);
          local_5e8._0_4_ = auVar70._0_4_ * auVar169._0_4_ + auVar179._0_4_ * auVar89._0_4_;
          local_5e8._4_4_ = auVar70._4_4_ * auVar169._4_4_ + auVar179._4_4_ * auVar89._4_4_;
          local_5e8._8_4_ = auVar70._8_4_ * auVar169._8_4_ + auVar179._8_4_ * auVar89._8_4_;
          local_5e8._12_4_ = auVar70._12_4_ * auVar169._12_4_ + auVar179._12_4_ * auVar89._12_4_;
          auVar104 = vmovshdup_avx(local_5e8);
          auVar89 = vsubps_avx(auVar144,auVar112);
          auVar165._0_4_ = auVar89._0_4_ * 3.0;
          auVar165._4_4_ = auVar89._4_4_ * 3.0;
          auVar165._8_4_ = auVar89._8_4_ * 3.0;
          auVar165._12_4_ = auVar89._12_4_ * 3.0;
          auVar89 = vsubps_avx(auVar203,auVar144);
          auVar182._0_4_ = auVar89._0_4_ * 3.0;
          auVar182._4_4_ = auVar89._4_4_ * 3.0;
          auVar182._8_4_ = auVar89._8_4_ * 3.0;
          auVar182._12_4_ = auVar89._12_4_ * 3.0;
          auVar89 = vsubps_avx(auVar212,auVar203);
          auVar228._0_4_ = auVar89._0_4_ * 3.0;
          auVar228._4_4_ = auVar89._4_4_ * 3.0;
          auVar228._8_4_ = auVar89._8_4_ * 3.0;
          auVar228._12_4_ = auVar89._12_4_ * 3.0;
          auVar179 = vminps_avx(auVar182,auVar228);
          auVar89 = vmaxps_avx(auVar182,auVar228);
          auVar179 = vminps_avx(auVar165,auVar179);
          auVar89 = vmaxps_avx(auVar165,auVar89);
          auVar169 = vshufpd_avx(auVar179,auVar179,3);
          auVar70 = vshufpd_avx(auVar89,auVar89,3);
          auVar179 = vminps_avx(auVar179,auVar169);
          auVar89 = vmaxps_avx(auVar89,auVar70);
          auVar169 = vshufps_avx(ZEXT416((uint)(1.0 / fVar136)),ZEXT416((uint)(1.0 / fVar136)),0);
          auVar166._0_4_ = auVar169._0_4_ * auVar179._0_4_;
          auVar166._4_4_ = auVar169._4_4_ * auVar179._4_4_;
          auVar166._8_4_ = auVar169._8_4_ * auVar179._8_4_;
          auVar166._12_4_ = auVar169._12_4_ * auVar179._12_4_;
          auVar183._0_4_ = auVar89._0_4_ * auVar169._0_4_;
          auVar183._4_4_ = auVar89._4_4_ * auVar169._4_4_;
          auVar183._8_4_ = auVar89._8_4_ * auVar169._8_4_;
          auVar183._12_4_ = auVar89._12_4_ * auVar169._12_4_;
          auVar73 = ZEXT416((uint)(1.0 / (auVar104._0_4_ - local_5e8._0_4_)));
          auVar89 = vshufpd_avx(auVar112,auVar112,3);
          auVar179 = vshufpd_avx(auVar144,auVar144,3);
          auVar169 = vshufpd_avx(auVar203,auVar203,3);
          auVar70 = vshufpd_avx(auVar212,auVar212,3);
          auVar89 = vsubps_avx(auVar89,auVar112);
          auVar88 = vsubps_avx(auVar179,auVar144);
          auVar68 = vsubps_avx(auVar169,auVar203);
          auVar70 = vsubps_avx(auVar70,auVar212);
          auVar179 = vminps_avx(auVar89,auVar88);
          auVar89 = vmaxps_avx(auVar89,auVar88);
          auVar169 = vminps_avx(auVar68,auVar70);
          auVar169 = vminps_avx(auVar179,auVar169);
          auVar179 = vmaxps_avx(auVar68,auVar70);
          auVar89 = vmaxps_avx(auVar89,auVar179);
          auVar179 = vshufps_avx(auVar73,auVar73,0);
          auVar238._0_4_ = auVar179._0_4_ * auVar169._0_4_;
          auVar238._4_4_ = auVar179._4_4_ * auVar169._4_4_;
          auVar238._8_4_ = auVar179._8_4_ * auVar169._8_4_;
          auVar238._12_4_ = auVar179._12_4_ * auVar169._12_4_;
          auVar251._0_4_ = auVar179._0_4_ * auVar89._0_4_;
          auVar251._4_4_ = auVar179._4_4_ * auVar89._4_4_;
          auVar251._8_4_ = auVar179._8_4_ * auVar89._8_4_;
          auVar251._12_4_ = auVar179._12_4_ * auVar89._12_4_;
          auVar89 = vmovsldup_avx(local_5e8);
          auVar204._4_12_ = auVar89._4_12_;
          auVar204._0_4_ = fVar172;
          auVar213._4_12_ = local_5e8._4_12_;
          auVar213._0_4_ = fVar171;
          auVar74._0_4_ = (fVar171 + fVar172) * 0.5;
          auVar74._4_4_ = (local_5e8._4_4_ + auVar89._4_4_) * 0.5;
          auVar74._8_4_ = (local_5e8._8_4_ + auVar89._8_4_) * 0.5;
          auVar74._12_4_ = (local_5e8._12_4_ + auVar89._12_4_) * 0.5;
          auVar89 = vshufps_avx(auVar74,auVar74,0);
          fVar137 = auVar89._0_4_;
          fVar173 = auVar89._4_4_;
          fVar138 = auVar89._8_4_;
          fVar174 = auVar89._12_4_;
          local_468 = auVar16._0_4_;
          fStack_464 = auVar16._4_4_;
          fStack_460 = auVar16._8_4_;
          fStack_45c = auVar16._12_4_;
          auVar145._0_4_ = fVar137 * (float)local_238._0_4_ + local_468;
          auVar145._4_4_ = fVar173 * (float)local_238._4_4_ + fStack_464;
          auVar145._8_4_ = fVar138 * fStack_230 + fStack_460;
          auVar145._12_4_ = fVar174 * fStack_22c + fStack_45c;
          local_478 = auVar250._0_4_;
          fStack_474 = auVar250._4_4_;
          fStack_470 = auVar250._8_4_;
          fStack_46c = auVar250._12_4_;
          auVar229._0_4_ = fVar137 * (float)local_248._0_4_ + local_478;
          auVar229._4_4_ = fVar173 * (float)local_248._4_4_ + fStack_474;
          auVar229._8_4_ = fVar138 * fStack_240 + fStack_470;
          auVar229._12_4_ = fVar174 * fStack_23c + fStack_46c;
          local_488 = auVar17._0_4_;
          fStack_484 = auVar17._4_4_;
          fStack_480 = auVar17._8_4_;
          fStack_47c = auVar17._12_4_;
          auVar264._0_4_ = fVar137 * (float)local_258._0_4_ + local_488;
          auVar264._4_4_ = fVar173 * (float)local_258._4_4_ + fStack_484;
          auVar264._8_4_ = fVar138 * fStack_250 + fStack_480;
          auVar264._12_4_ = fVar174 * fStack_24c + fStack_47c;
          auVar89 = vsubps_avx(auVar229,auVar145);
          auVar146._0_4_ = auVar89._0_4_ * fVar137 + auVar145._0_4_;
          auVar146._4_4_ = auVar89._4_4_ * fVar173 + auVar145._4_4_;
          auVar146._8_4_ = auVar89._8_4_ * fVar138 + auVar145._8_4_;
          auVar146._12_4_ = auVar89._12_4_ * fVar174 + auVar145._12_4_;
          auVar89 = vsubps_avx(auVar264,auVar229);
          auVar230._0_4_ = auVar229._0_4_ + auVar89._0_4_ * fVar137;
          auVar230._4_4_ = auVar229._4_4_ + auVar89._4_4_ * fVar173;
          auVar230._8_4_ = auVar229._8_4_ + auVar89._8_4_ * fVar138;
          auVar230._12_4_ = auVar229._12_4_ + auVar89._12_4_ * fVar174;
          auVar89 = vsubps_avx(auVar230,auVar146);
          fVar137 = auVar146._0_4_ + auVar89._0_4_ * fVar137;
          fVar173 = auVar146._4_4_ + auVar89._4_4_ * fVar173;
          auVar113._0_8_ = CONCAT44(fVar173,fVar137);
          auVar113._8_4_ = auVar146._8_4_ + auVar89._8_4_ * fVar138;
          auVar113._12_4_ = auVar146._12_4_ + auVar89._12_4_ * fVar174;
          fVar138 = auVar89._0_4_ * 3.0;
          fVar174 = auVar89._4_4_ * 3.0;
          auVar147._0_8_ = CONCAT44(fVar174,fVar138);
          auVar147._8_4_ = auVar89._8_4_ * 3.0;
          auVar147._12_4_ = auVar89._12_4_ * 3.0;
          auVar231._8_8_ = auVar113._0_8_;
          auVar231._0_8_ = auVar113._0_8_;
          auVar89 = vshufpd_avx(auVar113,auVar113,3);
          auVar179 = vshufps_avx(auVar74,auVar74,0x55);
          auVar68 = vsubps_avx(auVar89,auVar231);
          auVar232._0_4_ = auVar179._0_4_ * auVar68._0_4_ + fVar137;
          auVar232._4_4_ = auVar179._4_4_ * auVar68._4_4_ + fVar173;
          auVar232._8_4_ = auVar179._8_4_ * auVar68._8_4_ + fVar137;
          auVar232._12_4_ = auVar179._12_4_ * auVar68._12_4_ + fVar173;
          auVar283._8_8_ = auVar147._0_8_;
          auVar283._0_8_ = auVar147._0_8_;
          auVar89 = vshufpd_avx(auVar147,auVar147,1);
          auVar89 = vsubps_avx(auVar89,auVar283);
          auVar148._0_4_ = fVar138 + auVar179._0_4_ * auVar89._0_4_;
          auVar148._4_4_ = fVar174 + auVar179._4_4_ * auVar89._4_4_;
          auVar148._8_4_ = fVar138 + auVar179._8_4_ * auVar89._8_4_;
          auVar148._12_4_ = fVar174 + auVar179._12_4_ * auVar89._12_4_;
          auVar179 = vmovshdup_avx(auVar148);
          auVar284._0_8_ = auVar179._0_8_ ^ 0x8000000080000000;
          auVar284._8_4_ = auVar179._8_4_ ^ 0x80000000;
          auVar284._12_4_ = auVar179._12_4_ ^ 0x80000000;
          auVar169 = vmovshdup_avx(auVar68);
          auVar89 = vunpcklps_avx(auVar169,auVar284);
          auVar70 = vshufps_avx(auVar89,auVar284,4);
          auVar114._0_8_ = auVar68._0_8_ ^ 0x8000000080000000;
          auVar114._8_4_ = -auVar68._8_4_;
          auVar114._12_4_ = -auVar68._12_4_;
          auVar89 = vmovlhps_avx(auVar114,auVar148);
          auVar88 = vshufps_avx(auVar89,auVar148,8);
          auVar89 = ZEXT416((uint)(auVar169._0_4_ * auVar148._0_4_ - auVar179._0_4_ * auVar68._0_4_)
                           );
          auVar179 = vshufps_avx(auVar89,auVar89,0);
          auVar89 = vdivps_avx(auVar70,auVar179);
          auVar179 = vdivps_avx(auVar88,auVar179);
          auVar88 = vinsertps_avx(auVar166,auVar238,0x1c);
          auVar68 = vinsertps_avx(auVar183,auVar251,0x1c);
          auVar73 = vinsertps_avx(auVar238,auVar166,0x4c);
          auVar110 = vinsertps_avx(auVar251,auVar183,0x4c);
          auVar169 = vmovsldup_avx(auVar89);
          auVar252._0_4_ = auVar169._0_4_ * auVar88._0_4_;
          auVar252._4_4_ = auVar169._4_4_ * auVar88._4_4_;
          auVar252._8_4_ = auVar169._8_4_ * auVar88._8_4_;
          auVar252._12_4_ = auVar169._12_4_ * auVar88._12_4_;
          auVar239._0_4_ = auVar169._0_4_ * auVar68._0_4_;
          auVar239._4_4_ = auVar169._4_4_ * auVar68._4_4_;
          auVar239._8_4_ = auVar169._8_4_ * auVar68._8_4_;
          auVar239._12_4_ = auVar169._12_4_ * auVar68._12_4_;
          auVar70 = vminps_avx(auVar252,auVar239);
          auVar169 = vmaxps_avx(auVar239,auVar252);
          auVar103 = vmovsldup_avx(auVar179);
          auVar304._0_4_ = auVar103._0_4_ * auVar73._0_4_;
          auVar304._4_4_ = auVar103._4_4_ * auVar73._4_4_;
          auVar304._8_4_ = auVar103._8_4_ * auVar73._8_4_;
          auVar304._12_4_ = auVar103._12_4_ * auVar73._12_4_;
          auVar240._0_4_ = auVar103._0_4_ * auVar110._0_4_;
          auVar240._4_4_ = auVar103._4_4_ * auVar110._4_4_;
          auVar240._8_4_ = auVar103._8_4_ * auVar110._8_4_;
          auVar240._12_4_ = auVar103._12_4_ * auVar110._12_4_;
          auVar103 = vminps_avx(auVar304,auVar240);
          auVar91._0_4_ = auVar70._0_4_ + auVar103._0_4_;
          auVar91._4_4_ = auVar70._4_4_ + auVar103._4_4_;
          auVar91._8_4_ = auVar70._8_4_ + auVar103._8_4_;
          auVar91._12_4_ = auVar70._12_4_ + auVar103._12_4_;
          auVar70 = vmaxps_avx(auVar240,auVar304);
          auVar103 = vsubps_avx(auVar204,auVar74);
          auVar105 = vsubps_avx(auVar213,auVar74);
          auVar214._0_4_ = auVar169._0_4_ + auVar70._0_4_;
          auVar214._4_4_ = auVar169._4_4_ + auVar70._4_4_;
          auVar214._8_4_ = auVar169._8_4_ + auVar70._8_4_;
          auVar214._12_4_ = auVar169._12_4_ + auVar70._12_4_;
          auVar253._8_8_ = 0x3f800000;
          auVar253._0_8_ = 0x3f800000;
          auVar169 = vsubps_avx(auVar253,auVar214);
          auVar70 = vsubps_avx(auVar253,auVar91);
          fVar191 = auVar103._0_4_;
          auVar254._0_4_ = fVar191 * auVar169._0_4_;
          fVar298 = auVar103._4_4_;
          auVar254._4_4_ = fVar298 * auVar169._4_4_;
          fVar235 = auVar103._8_4_;
          auVar254._8_4_ = fVar235 * auVar169._8_4_;
          fVar245 = auVar103._12_4_;
          auVar254._12_4_ = fVar245 * auVar169._12_4_;
          fVar138 = auVar105._0_4_;
          auVar215._0_4_ = auVar169._0_4_ * fVar138;
          fVar174 = auVar105._4_4_;
          auVar215._4_4_ = auVar169._4_4_ * fVar174;
          fVar188 = auVar105._8_4_;
          auVar215._8_4_ = auVar169._8_4_ * fVar188;
          fVar190 = auVar105._12_4_;
          auVar215._12_4_ = auVar169._12_4_ * fVar190;
          auVar294._0_4_ = fVar191 * auVar70._0_4_;
          auVar294._4_4_ = fVar298 * auVar70._4_4_;
          auVar294._8_4_ = fVar235 * auVar70._8_4_;
          auVar294._12_4_ = fVar245 * auVar70._12_4_;
          auVar92._0_4_ = fVar138 * auVar70._0_4_;
          auVar92._4_4_ = fVar174 * auVar70._4_4_;
          auVar92._8_4_ = fVar188 * auVar70._8_4_;
          auVar92._12_4_ = fVar190 * auVar70._12_4_;
          auVar169 = vminps_avx(auVar254,auVar294);
          auVar70 = vminps_avx(auVar215,auVar92);
          auVar103 = vminps_avx(auVar169,auVar70);
          auVar169 = vmaxps_avx(auVar294,auVar254);
          auVar70 = vmaxps_avx(auVar92,auVar215);
          auVar105 = vshufps_avx(auVar74,auVar74,0x54);
          auVar70 = vmaxps_avx(auVar70,auVar169);
          auVar119 = vshufps_avx(auVar232,auVar232,0);
          auVar120 = vshufps_avx(auVar232,auVar232,0x55);
          auVar169 = vhaddps_avx(auVar103,auVar103);
          auVar70 = vhaddps_avx(auVar70,auVar70);
          auVar216._0_4_ = auVar119._0_4_ * auVar89._0_4_ + auVar120._0_4_ * auVar179._0_4_;
          auVar216._4_4_ = auVar119._4_4_ * auVar89._4_4_ + auVar120._4_4_ * auVar179._4_4_;
          auVar216._8_4_ = auVar119._8_4_ * auVar89._8_4_ + auVar120._8_4_ * auVar179._8_4_;
          auVar216._12_4_ = auVar119._12_4_ * auVar89._12_4_ + auVar120._12_4_ * auVar179._12_4_;
          auVar103 = vsubps_avx(auVar105,auVar216);
          fVar137 = auVar103._0_4_ + auVar169._0_4_;
          fVar173 = auVar103._0_4_ + auVar70._0_4_;
          auVar169 = vmaxss_avx(ZEXT416((uint)fVar172),ZEXT416((uint)fVar137));
          auVar70 = vminss_avx(ZEXT416((uint)fVar173),ZEXT416((uint)fVar171));
          if (auVar169._0_4_ <= auVar70._0_4_) {
            auVar169 = vmovshdup_avx(auVar89);
            auVar127._0_4_ = auVar88._0_4_ * auVar169._0_4_;
            auVar127._4_4_ = auVar88._4_4_ * auVar169._4_4_;
            auVar127._8_4_ = auVar88._8_4_ * auVar169._8_4_;
            auVar127._12_4_ = auVar88._12_4_ * auVar169._12_4_;
            auVar93._0_4_ = auVar68._0_4_ * auVar169._0_4_;
            auVar93._4_4_ = auVar68._4_4_ * auVar169._4_4_;
            auVar93._8_4_ = auVar68._8_4_ * auVar169._8_4_;
            auVar93._12_4_ = auVar68._12_4_ * auVar169._12_4_;
            auVar70 = vminps_avx(auVar127,auVar93);
            auVar169 = vmaxps_avx(auVar93,auVar127);
            auVar88 = vmovshdup_avx(auVar179);
            auVar167._0_4_ = auVar88._0_4_ * auVar73._0_4_;
            auVar167._4_4_ = auVar88._4_4_ * auVar73._4_4_;
            auVar167._8_4_ = auVar88._8_4_ * auVar73._8_4_;
            auVar167._12_4_ = auVar88._12_4_ * auVar73._12_4_;
            auVar128._0_4_ = auVar88._0_4_ * auVar110._0_4_;
            auVar128._4_4_ = auVar88._4_4_ * auVar110._4_4_;
            auVar128._8_4_ = auVar88._8_4_ * auVar110._8_4_;
            auVar128._12_4_ = auVar88._12_4_ * auVar110._12_4_;
            auVar88 = vminps_avx(auVar167,auVar128);
            auVar184._0_4_ = auVar70._0_4_ + auVar88._0_4_;
            auVar184._4_4_ = auVar70._4_4_ + auVar88._4_4_;
            auVar184._8_4_ = auVar70._8_4_ + auVar88._8_4_;
            auVar184._12_4_ = auVar70._12_4_ + auVar88._12_4_;
            auVar70 = vmaxps_avx(auVar128,auVar167);
            auVar94._0_4_ = auVar169._0_4_ + auVar70._0_4_;
            auVar94._4_4_ = auVar169._4_4_ + auVar70._4_4_;
            auVar94._8_4_ = auVar169._8_4_ + auVar70._8_4_;
            auVar94._12_4_ = auVar169._12_4_ + auVar70._12_4_;
            auVar169 = vsubps_avx(auVar126,auVar94);
            auVar70 = vsubps_avx(auVar126,auVar184);
            auVar168._0_4_ = fVar191 * auVar169._0_4_;
            auVar168._4_4_ = fVar298 * auVar169._4_4_;
            auVar168._8_4_ = fVar235 * auVar169._8_4_;
            auVar168._12_4_ = fVar245 * auVar169._12_4_;
            auVar185._0_4_ = fVar191 * auVar70._0_4_;
            auVar185._4_4_ = fVar298 * auVar70._4_4_;
            auVar185._8_4_ = fVar235 * auVar70._8_4_;
            auVar185._12_4_ = fVar245 * auVar70._12_4_;
            auVar95._0_4_ = fVar138 * auVar169._0_4_;
            auVar95._4_4_ = fVar174 * auVar169._4_4_;
            auVar95._8_4_ = fVar188 * auVar169._8_4_;
            auVar95._12_4_ = fVar190 * auVar169._12_4_;
            auVar129._0_4_ = fVar138 * auVar70._0_4_;
            auVar129._4_4_ = fVar174 * auVar70._4_4_;
            auVar129._8_4_ = fVar188 * auVar70._8_4_;
            auVar129._12_4_ = fVar190 * auVar70._12_4_;
            auVar169 = vminps_avx(auVar168,auVar185);
            auVar70 = vminps_avx(auVar95,auVar129);
            auVar169 = vminps_avx(auVar169,auVar70);
            auVar70 = vmaxps_avx(auVar185,auVar168);
            auVar88 = vmaxps_avx(auVar129,auVar95);
            auVar169 = vhaddps_avx(auVar169,auVar169);
            auVar70 = vmaxps_avx(auVar88,auVar70);
            auVar70 = vhaddps_avx(auVar70,auVar70);
            auVar88 = vmovshdup_avx(auVar103);
            auVar68 = ZEXT416((uint)(auVar88._0_4_ + auVar169._0_4_));
            auVar169 = vmaxss_avx(local_5e8,auVar68);
            auVar88 = ZEXT416((uint)(auVar88._0_4_ + auVar70._0_4_));
            auVar70 = vminss_avx(auVar88,auVar104);
            auVar241._8_4_ = 0x7fffffff;
            auVar241._0_8_ = 0x7fffffff7fffffff;
            auVar241._12_4_ = 0x7fffffff;
            if (auVar169._0_4_ <= auVar70._0_4_) {
              uVar62 = 0;
              auVar295._8_4_ = 0x3f800000;
              auVar295._0_8_ = &DAT_3f8000003f800000;
              auVar295._12_4_ = 0x3f800000;
              auVar306 = ZEXT864(0) << 0x20;
              if ((fVar172 < fVar137) && (uVar62 = 0, fVar173 < fVar171)) {
                auVar169 = vcmpps_avx(auVar88,auVar104,1);
                auVar70 = vcmpps_avx(local_5e8,auVar68,1);
                auVar169 = vandps_avx(auVar70,auVar169);
                uVar62 = auVar169._0_4_;
              }
              if (((uint)uVar66 < 4 && 0.001 <= fVar136) && (uVar62 & 1) == 0) {
                bVar54 = false;
              }
              else {
                lVar63 = 200;
                do {
                  fVar137 = auVar103._0_4_;
                  fVar136 = 1.0 - fVar137;
                  auVar169 = ZEXT416((uint)(fVar136 * fVar136 * fVar136));
                  auVar169 = vshufps_avx(auVar169,auVar169,0);
                  auVar70 = ZEXT416((uint)(fVar137 * 3.0 * fVar136 * fVar136));
                  auVar70 = vshufps_avx(auVar70,auVar70,0);
                  auVar88 = ZEXT416((uint)(fVar136 * fVar137 * fVar137 * 3.0));
                  auVar88 = vshufps_avx(auVar88,auVar88,0);
                  auVar68 = ZEXT416((uint)(fVar137 * fVar137 * fVar137));
                  auVar68 = vshufps_avx(auVar68,auVar68,0);
                  local_578._0_4_ = auVar69._0_4_;
                  local_578._4_4_ = auVar69._4_4_;
                  fStack_570 = auVar69._8_4_;
                  fStack_56c = auVar69._12_4_;
                  fVar136 = local_468 * auVar169._0_4_ +
                            local_478 * auVar70._0_4_ +
                            auVar68._0_4_ * (float)local_578._0_4_ + local_488 * auVar88._0_4_;
                  fVar137 = fStack_464 * auVar169._4_4_ +
                            fStack_474 * auVar70._4_4_ +
                            auVar68._4_4_ * (float)local_578._4_4_ + fStack_484 * auVar88._4_4_;
                  auVar96._0_8_ = CONCAT44(fVar137,fVar136);
                  auVar96._8_4_ =
                       fStack_460 * auVar169._8_4_ +
                       fStack_470 * auVar70._8_4_ +
                       auVar68._8_4_ * fStack_570 + fStack_480 * auVar88._8_4_;
                  auVar96._12_4_ =
                       fStack_45c * auVar169._12_4_ +
                       fStack_46c * auVar70._12_4_ +
                       auVar68._12_4_ * fStack_56c + fStack_47c * auVar88._12_4_;
                  auVar130._8_8_ = auVar96._0_8_;
                  auVar130._0_8_ = auVar96._0_8_;
                  auVar70 = vshufpd_avx(auVar96,auVar96,1);
                  auVar169 = vmovshdup_avx(auVar103);
                  auVar70 = vsubps_avx(auVar70,auVar130);
                  auVar97._0_4_ = auVar169._0_4_ * auVar70._0_4_ + fVar136;
                  auVar97._4_4_ = auVar169._4_4_ * auVar70._4_4_ + fVar137;
                  auVar97._8_4_ = auVar169._8_4_ * auVar70._8_4_ + fVar136;
                  auVar97._12_4_ = auVar169._12_4_ * auVar70._12_4_ + fVar137;
                  auVar169 = vshufps_avx(auVar97,auVar97,0);
                  auVar70 = vshufps_avx(auVar97,auVar97,0x55);
                  auVar131._0_4_ = auVar89._0_4_ * auVar169._0_4_ + auVar179._0_4_ * auVar70._0_4_;
                  auVar131._4_4_ = auVar89._4_4_ * auVar169._4_4_ + auVar179._4_4_ * auVar70._4_4_;
                  auVar131._8_4_ = auVar89._8_4_ * auVar169._8_4_ + auVar179._8_4_ * auVar70._8_4_;
                  auVar131._12_4_ =
                       auVar89._12_4_ * auVar169._12_4_ + auVar179._12_4_ * auVar70._12_4_;
                  auVar103 = vsubps_avx(auVar103,auVar131);
                  auVar169 = vandps_avx(auVar241,auVar97);
                  auVar70 = vshufps_avx(auVar169,auVar169,0xf5);
                  auVar169 = vmaxss_avx(auVar70,auVar169);
                  if (auVar169._0_4_ < fVar118) {
                    fVar136 = auVar103._0_4_;
                    if ((0.0 <= fVar136) && (fVar136 <= 1.0)) {
                      auVar89 = vmovshdup_avx(auVar103);
                      fVar137 = auVar89._0_4_;
                      if ((0.0 <= fVar137) && (fVar137 <= 1.0)) {
                        auVar89 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                                ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),
                                                0x1c);
                        auVar110 = vinsertps_avx(auVar89,ZEXT416((uint)pre->ray_space[k].vz.field_0.
                                                                       m128[2]),0x28);
                        auVar89 = vdpps_avx(auVar110,local_268,0x7f);
                        auVar179 = vdpps_avx(auVar110,local_278,0x7f);
                        auVar169 = vdpps_avx(auVar110,local_288,0x7f);
                        auVar70 = vdpps_avx(auVar110,local_298,0x7f);
                        auVar88 = vdpps_avx(auVar110,local_2a8,0x7f);
                        auVar68 = vdpps_avx(auVar110,local_2b8,0x7f);
                        auVar73 = vdpps_avx(auVar110,local_2c8,0x7f);
                        auVar110 = vdpps_avx(auVar110,local_2d8,0x7f);
                        fVar190 = 1.0 - fVar137;
                        fVar191 = 1.0 - fVar136;
                        fVar173 = auVar103._4_4_;
                        fVar138 = auVar103._8_4_;
                        fVar174 = auVar103._12_4_;
                        fVar188 = fVar191 * fVar136 * fVar136 * 3.0;
                        auVar205._0_4_ = fVar136 * fVar136 * fVar136;
                        auVar205._4_4_ = fVar173 * fVar173 * fVar173;
                        auVar205._8_4_ = fVar138 * fVar138 * fVar138;
                        auVar205._12_4_ = fVar174 * fVar174 * fVar174;
                        fVar138 = fVar191 * fVar191 * fVar136 * 3.0;
                        fVar174 = fVar191 * fVar191 * fVar191;
                        fVar173 = fVar174 * (fVar190 * auVar89._0_4_ + fVar137 * auVar88._0_4_) +
                                  (fVar190 * auVar179._0_4_ + auVar68._0_4_ * fVar137) * fVar138 +
                                  fVar188 * (auVar73._0_4_ * fVar137 + fVar190 * auVar169._0_4_) +
                                  auVar205._0_4_ *
                                  (fVar190 * auVar70._0_4_ + fVar137 * auVar110._0_4_);
                        if (((fVar154 <= fVar173) &&
                            (fVar190 = *(float *)(ray + k * 4 + 0x80), fVar173 <= fVar190)) &&
                           (pGVar11 = (context->scene->geometries).items[uVar61].ptr,
                           (pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) != 0)) {
                          local_1a8 = vshufps_avx(auVar103,auVar103,0x55);
                          auVar89 = vsubps_avx(auVar295,local_1a8);
                          fVar298 = local_1a8._0_4_;
                          fVar235 = local_1a8._4_4_;
                          fVar245 = local_1a8._8_4_;
                          fVar247 = local_1a8._12_4_;
                          fVar257 = auVar89._0_4_;
                          fVar258 = auVar89._4_4_;
                          fVar260 = auVar89._8_4_;
                          fVar266 = auVar89._12_4_;
                          auVar242._0_4_ =
                               fVar298 * (float)local_3b8._0_4_ + fVar257 * (float)local_3a8._0_4_;
                          auVar242._4_4_ =
                               fVar235 * (float)local_3b8._4_4_ + fVar258 * (float)local_3a8._4_4_;
                          auVar242._8_4_ = fVar245 * fStack_3b0 + fVar260 * fStack_3a0;
                          auVar242._12_4_ = fVar247 * fStack_3ac + fVar266 * fStack_39c;
                          auVar255._0_4_ =
                               fVar298 * (float)local_3f8._0_4_ + fVar257 * (float)local_3d8._0_4_;
                          auVar255._4_4_ =
                               fVar235 * (float)local_3f8._4_4_ + fVar258 * (float)local_3d8._4_4_;
                          auVar255._8_4_ = fVar245 * fStack_3f0 + fVar260 * fStack_3d0;
                          auVar255._12_4_ = fVar247 * fStack_3ec + fVar266 * fStack_3cc;
                          auVar265._0_4_ =
                               fVar298 * (float)local_2f8._0_4_ + fVar257 * (float)local_3e8._0_4_;
                          auVar265._4_4_ =
                               fVar235 * (float)local_2f8._4_4_ + fVar258 * (float)local_3e8._4_4_;
                          auVar265._8_4_ = fVar245 * fStack_2f0 + fVar260 * fStack_3e0;
                          auVar265._12_4_ = fVar247 * fStack_2ec + fVar266 * fStack_3dc;
                          auVar233._0_4_ = fVar298 * fVar300 + fVar257 * (float)local_3c8._0_4_;
                          auVar233._4_4_ = fVar235 * fVar244 + fVar258 * (float)local_3c8._4_4_;
                          auVar233._8_4_ = fVar245 * fVar246 + fVar260 * fStack_3c0;
                          auVar233._12_4_ = fVar247 * fVar256 + fVar266 * fStack_3bc;
                          auVar70 = vsubps_avx(auVar255,auVar242);
                          auVar88 = vsubps_avx(auVar265,auVar255);
                          auVar68 = vsubps_avx(auVar233,auVar265);
                          local_1b8 = vshufps_avx(auVar103,auVar103,0);
                          fVar247 = local_1b8._0_4_;
                          fVar257 = local_1b8._4_4_;
                          fVar258 = local_1b8._8_4_;
                          fVar260 = local_1b8._12_4_;
                          auVar89 = vshufps_avx(ZEXT416((uint)fVar191),ZEXT416((uint)fVar191),0);
                          fVar191 = auVar89._0_4_;
                          fVar298 = auVar89._4_4_;
                          fVar235 = auVar89._8_4_;
                          fVar245 = auVar89._12_4_;
                          auVar89 = vshufps_avx(auVar205,auVar205,0);
                          auVar179 = vshufps_avx(ZEXT416((uint)fVar188),ZEXT416((uint)fVar188),0);
                          auVar169 = vshufps_avx(ZEXT416((uint)fVar138),ZEXT416((uint)fVar138),0);
                          auVar186._0_4_ =
                               (fVar191 * (fVar191 * auVar70._0_4_ + fVar247 * auVar88._0_4_) +
                               fVar247 * (fVar191 * auVar88._0_4_ + fVar247 * auVar68._0_4_)) * 3.0;
                          auVar186._4_4_ =
                               (fVar298 * (fVar298 * auVar70._4_4_ + fVar257 * auVar88._4_4_) +
                               fVar257 * (fVar298 * auVar88._4_4_ + fVar257 * auVar68._4_4_)) * 3.0;
                          auVar186._8_4_ =
                               (fVar235 * (fVar235 * auVar70._8_4_ + fVar258 * auVar88._8_4_) +
                               fVar258 * (fVar235 * auVar88._8_4_ + fVar258 * auVar68._8_4_)) * 3.0;
                          auVar186._12_4_ =
                               (fVar245 * (fVar245 * auVar70._12_4_ + fVar260 * auVar88._12_4_) +
                               fVar260 * (fVar245 * auVar88._12_4_ + fVar260 * auVar68._12_4_)) *
                               3.0;
                          auVar70 = vshufps_avx(ZEXT416((uint)fVar174),ZEXT416((uint)fVar174),0);
                          auVar149._0_4_ =
                               auVar70._0_4_ * (float)local_308._0_4_ +
                               auVar169._0_4_ * (float)local_318._0_4_ +
                               auVar89._0_4_ * (float)local_338._0_4_ +
                               auVar179._0_4_ * (float)local_328._0_4_;
                          auVar149._4_4_ =
                               auVar70._4_4_ * (float)local_308._4_4_ +
                               auVar169._4_4_ * (float)local_318._4_4_ +
                               auVar89._4_4_ * (float)local_338._4_4_ +
                               auVar179._4_4_ * (float)local_328._4_4_;
                          auVar149._8_4_ =
                               auVar70._8_4_ * fStack_300 +
                               auVar169._8_4_ * fStack_310 +
                               auVar89._8_4_ * fStack_330 + auVar179._8_4_ * fStack_320;
                          auVar149._12_4_ =
                               auVar70._12_4_ * fStack_2fc +
                               auVar169._12_4_ * fStack_30c +
                               auVar89._12_4_ * fStack_32c + auVar179._12_4_ * fStack_31c;
                          auVar89 = vshufps_avx(auVar186,auVar186,0xc9);
                          auVar170._0_4_ = auVar149._0_4_ * auVar89._0_4_;
                          auVar170._4_4_ = auVar149._4_4_ * auVar89._4_4_;
                          auVar170._8_4_ = auVar149._8_4_ * auVar89._8_4_;
                          auVar170._12_4_ = auVar149._12_4_ * auVar89._12_4_;
                          auVar89 = vshufps_avx(auVar149,auVar149,0xc9);
                          auVar150._0_4_ = auVar186._0_4_ * auVar89._0_4_;
                          auVar150._4_4_ = auVar186._4_4_ * auVar89._4_4_;
                          auVar150._8_4_ = auVar186._8_4_ * auVar89._8_4_;
                          auVar150._12_4_ = auVar186._12_4_ * auVar89._12_4_;
                          auVar89 = vsubps_avx(auVar150,auVar170);
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            *(float *)(ray + k * 4 + 0x80) = fVar173;
                            uVar6 = vextractps_avx(auVar89,1);
                            *(undefined4 *)(ray + k * 4 + 0xc0) = uVar6;
                            uVar6 = vextractps_avx(auVar89,2);
                            *(undefined4 *)(ray + k * 4 + 0xd0) = uVar6;
                            *(int *)(ray + k * 4 + 0xe0) = auVar89._0_4_;
                            *(float *)(ray + k * 4 + 0xf0) = fVar136;
                            *(float *)(ray + k * 4 + 0x100) = fVar137;
                            *(uint *)(ray + k * 4 + 0x110) = uVar10;
                            *(uint *)(ray + k * 4 + 0x120) = uVar61;
                            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                          }
                          else {
                            auVar179 = vshufps_avx(auVar89,auVar89,0x55);
                            local_1d8 = vshufps_avx(auVar89,auVar89,0xaa);
                            local_1c8 = vshufps_avx(auVar89,auVar89,0);
                            local_1e8[0] = (RTCHitN)auVar179[0];
                            local_1e8[1] = (RTCHitN)auVar179[1];
                            local_1e8[2] = (RTCHitN)auVar179[2];
                            local_1e8[3] = (RTCHitN)auVar179[3];
                            local_1e8[4] = (RTCHitN)auVar179[4];
                            local_1e8[5] = (RTCHitN)auVar179[5];
                            local_1e8[6] = (RTCHitN)auVar179[6];
                            local_1e8[7] = (RTCHitN)auVar179[7];
                            local_1e8[8] = (RTCHitN)auVar179[8];
                            local_1e8[9] = (RTCHitN)auVar179[9];
                            local_1e8[10] = (RTCHitN)auVar179[10];
                            local_1e8[0xb] = (RTCHitN)auVar179[0xb];
                            local_1e8[0xc] = (RTCHitN)auVar179[0xc];
                            local_1e8[0xd] = (RTCHitN)auVar179[0xd];
                            local_1e8[0xe] = (RTCHitN)auVar179[0xe];
                            local_1e8[0xf] = (RTCHitN)auVar179[0xf];
                            local_198 = local_368._0_8_;
                            uStack_190 = local_368._8_8_;
                            local_188 = local_358._0_8_;
                            uStack_180 = local_358._8_8_;
                            vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                            uStack_174 = context->user->instID[0];
                            local_178 = uStack_174;
                            uStack_170 = uStack_174;
                            uStack_16c = uStack_174;
                            uStack_168 = context->user->instPrimID[0];
                            uStack_164 = uStack_168;
                            uStack_160 = uStack_168;
                            uStack_15c = uStack_168;
                            *(float *)(ray + k * 4 + 0x80) = fVar173;
                            local_448 = *local_430;
                            uStack_440 = local_430[1];
                            local_428.valid = (int *)&local_448;
                            local_428.geometryUserPtr = pGVar11->userPtr;
                            local_428.context = context->user;
                            local_428.hit = local_1e8;
                            local_428.N = 4;
                            local_428.ray = (RTCRayN *)ray;
                            if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                              (*pGVar11->intersectionFilterN)(&local_428);
                            }
                            auVar59._8_8_ = uStack_440;
                            auVar59._0_8_ = local_448;
                            if (auVar59 == (undefined1  [16])0x0) {
                              auVar306 = ZEXT1664(ZEXT816(0));
                              auVar89 = vpcmpeqd_avx(ZEXT816(0),(undefined1  [16])0x0);
                              auVar89 = auVar89 ^ _DAT_01febe20;
                            }
                            else {
                              p_Var12 = context->args->filter;
                              auVar306 = ZEXT1664(ZEXT816(0));
                              auVar89 = vpcmpeqd_avx(auVar59,auVar59);
                              if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar306._0_8_ = (*p_Var12)(&local_428);
                                auVar306._8_56_ = extraout_var;
                                auVar89 = vpcmpeqd_avx(auVar306._0_16_,auVar306._0_16_);
                                auVar306 = ZEXT1664(ZEXT816(0) << 0x40);
                              }
                              auVar60._8_8_ = uStack_440;
                              auVar60._0_8_ = local_448;
                              auVar179 = vpcmpeqd_avx(auVar306._0_16_,auVar60);
                              auVar89 = auVar179 ^ auVar89;
                              auVar169 = vpcmpeqd_avx(auVar60,auVar60);
                              if (auVar60 != (undefined1  [16])0x0) {
                                auVar179 = auVar179 ^ auVar169;
                                auVar169 = vmaskmovps_avx(auVar179,*(undefined1 (*) [16])
                                                                    local_428.hit);
                                *(undefined1 (*) [16])(local_428.ray + 0xc0) = auVar169;
                                auVar169 = vmaskmovps_avx(auVar179,*(undefined1 (*) [16])
                                                                    (local_428.hit + 0x10));
                                *(undefined1 (*) [16])(local_428.ray + 0xd0) = auVar169;
                                auVar169 = vmaskmovps_avx(auVar179,*(undefined1 (*) [16])
                                                                    (local_428.hit + 0x20));
                                *(undefined1 (*) [16])(local_428.ray + 0xe0) = auVar169;
                                auVar169 = vmaskmovps_avx(auVar179,*(undefined1 (*) [16])
                                                                    (local_428.hit + 0x30));
                                *(undefined1 (*) [16])(local_428.ray + 0xf0) = auVar169;
                                auVar169 = vmaskmovps_avx(auVar179,*(undefined1 (*) [16])
                                                                    (local_428.hit + 0x40));
                                *(undefined1 (*) [16])(local_428.ray + 0x100) = auVar169;
                                auVar169 = vmaskmovps_avx(auVar179,*(undefined1 (*) [16])
                                                                    (local_428.hit + 0x50));
                                *(undefined1 (*) [16])(local_428.ray + 0x110) = auVar169;
                                auVar169 = vmaskmovps_avx(auVar179,*(undefined1 (*) [16])
                                                                    (local_428.hit + 0x60));
                                *(undefined1 (*) [16])(local_428.ray + 0x120) = auVar169;
                                auVar169 = vmaskmovps_avx(auVar179,*(undefined1 (*) [16])
                                                                    (local_428.hit + 0x70));
                                *(undefined1 (*) [16])(local_428.ray + 0x130) = auVar169;
                                auVar179 = vmaskmovps_avx(auVar179,*(undefined1 (*) [16])
                                                                    (local_428.hit + 0x80));
                                *(undefined1 (*) [16])(local_428.ray + 0x140) = auVar179;
                              }
                            }
                            auVar98._8_8_ = 0x100000001;
                            auVar98._0_8_ = 0x100000001;
                            if ((auVar98 & auVar89) == (undefined1  [16])0x0) {
                              *(float *)(ray + k * 4 + 0x80) = fVar190;
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                  lVar63 = lVar63 + -1;
                } while (lVar63 != 0);
              }
              goto LAB_00ee21c3;
            }
          }
          goto LAB_00ee21d9;
        }
      }
LAB_00ee21c3:
    } while (bVar54);
    local_538 = ZEXT416((uint)fVar172);
    local_2e8 = vinsertps_avx(local_538,ZEXT416((uint)fVar171),0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }